

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_pack4.h
# Opt level: O0

void ncnn::deformableconv2d_pack4_sse
               (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,Mat *top_blob,
               Mat *weight_data_packed,Mat *bias_data,int kernel_w,int kernel_h,int dilation_w,
               int dilation_h,int stride_w,int stride_h,int pad_left,int pad_top,int activation_type
               ,Mat *activation_params,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  size_type sVar144;
  const_reference pvVar145;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar146;
  float fVar147;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined4 in_stack_00000038;
  long *in_stack_00000040;
  __m128 _conv_w3;
  __m128 _conv_w2;
  __m128 _conv_w1;
  __m128 _conv_w0;
  __m128 _mask;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _v4_channel3;
  __m128 _v4_channel2;
  __m128 _v4_channel1;
  __m128 _v4_channel0;
  __m128 _v3_channel3;
  __m128 _v3_channel2;
  __m128 _v3_channel1;
  __m128 _v3_channel0;
  __m128 _v2_channel3;
  __m128 _v2_channel2;
  __m128 _v2_channel1;
  __m128 _v2_channel0;
  __m128 _v1_channel3;
  __m128 _v1_channel2;
  __m128 _v1_channel1;
  __m128 _v1_channel0;
  __m128 _val_channel3;
  __m128 _val_channel2;
  __m128 _val_channel1;
  __m128 _val_channel0;
  float *data_im_ptr;
  int ic;
  float *mask_ptr;
  float masks [4];
  float *w4_ptr;
  float w4s [4];
  float *w3_ptr;
  float w3s [4];
  float *w2_ptr;
  float w2s [4];
  float *w1_ptr;
  float w1s [4];
  float hw;
  float hh;
  float lw;
  float lh;
  int w_high;
  int h_high;
  int w_low;
  int h_low;
  int v4_pos;
  int v3_pos;
  int v2_pos;
  int v1_pos;
  bool v4_cond;
  bool v3_cond;
  bool v2_cond;
  bool v1_cond;
  float w4;
  float w3;
  float w2;
  float w1;
  bool cond;
  float w_im;
  float h_im;
  int m_c;
  Mat *mask;
  int x_c;
  int y_c;
  float mask_;
  float offset_w;
  float offset_h;
  int j;
  int i;
  __m128 _sum;
  float *outptr;
  float *kptr;
  int oc;
  int w_in;
  int h_in;
  int w_col;
  int h_col;
  float *zeros_ptr;
  float zeros [4];
  int wstep;
  int out_elempack;
  int elempack;
  float *bias_data_ptr;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  bool mask_not_pack;
  bool offset_not_pack;
  bool has_mask;
  Mat *offset;
  Mat *bottom_blob;
  Mat *m_1;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_4;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_3;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  bool local_30ed;
  bool local_30ec;
  bool local_30eb;
  bool local_30ea;
  bool local_30e9;
  bool local_2fb9;
  undefined8 local_2fb8;
  undefined8 uStack_2fb0;
  undefined8 local_2fa8;
  undefined8 uStack_2fa0;
  undefined8 local_2f98;
  undefined8 uStack_2f90;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  undefined8 local_2f68;
  undefined8 uStack_2f60;
  undefined8 local_2f58;
  undefined8 uStack_2f50;
  undefined8 local_2f48;
  undefined8 uStack_2f40;
  undefined8 local_2f38;
  undefined8 uStack_2f30;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  undefined8 local_2ef8;
  undefined8 uStack_2ef0;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  undefined8 local_2e98;
  undefined8 uStack_2e90;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 local_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  undefined8 local_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 local_2e38;
  undefined8 uStack_2e30;
  undefined1 local_2e28 [8];
  undefined8 uStack_2e20;
  undefined1 local_2e18 [8];
  undefined8 uStack_2e10;
  undefined1 local_2e08 [8];
  undefined8 uStack_2e00;
  undefined1 local_2df8 [8];
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  undefined8 local_2de0;
  undefined8 local_2dd8;
  undefined4 local_2dd0;
  Allocator *local_2dc8;
  undefined4 local_2dc0;
  undefined4 local_2dbc;
  undefined4 local_2db8;
  undefined4 local_2db4;
  undefined4 local_2db0;
  undefined8 local_2da8;
  void *local_2da0;
  int local_2d94;
  float *local_2d90;
  float local_2d88;
  float fStack_2d84;
  float fStack_2d80;
  float fStack_2d7c;
  float *local_2d70;
  float local_2d68;
  float fStack_2d64;
  float fStack_2d60;
  float fStack_2d5c;
  float *local_2d50;
  float local_2d48;
  float fStack_2d44;
  float fStack_2d40;
  float fStack_2d3c;
  float *local_2d30;
  float local_2d28;
  float fStack_2d24;
  float fStack_2d20;
  float fStack_2d1c;
  float *local_2d10;
  float local_2d08;
  float fStack_2d04;
  float fStack_2d00;
  float fStack_2cfc;
  float local_2cf8;
  float local_2cf4;
  float local_2cf0;
  float local_2cec;
  int local_2ce8;
  int local_2ce4;
  int local_2ce0;
  int local_2cdc;
  int local_2cd8;
  int local_2cd4;
  int local_2cd0;
  int local_2ccc;
  bool local_2cc8;
  bool local_2cc7;
  bool local_2cc6;
  bool local_2cc5;
  float local_2cc4;
  float local_2cc0;
  float local_2cbc;
  float local_2cb8;
  bool local_2cb1;
  float local_2cb0;
  float local_2cac;
  undefined8 local_2ca8;
  undefined8 local_2ca0;
  undefined8 local_2c98;
  undefined4 local_2c90;
  Allocator *local_2c88;
  undefined4 local_2c80;
  undefined4 local_2c7c;
  undefined4 local_2c78;
  undefined4 local_2c74;
  undefined4 local_2c70;
  undefined8 local_2c68;
  int local_2c5c;
  undefined8 local_2c58;
  undefined8 local_2c50;
  undefined8 local_2c48;
  undefined4 local_2c40;
  Allocator *local_2c38;
  undefined4 local_2c30;
  undefined4 local_2c2c;
  undefined4 local_2c28;
  undefined4 local_2c24;
  undefined4 local_2c20;
  undefined8 local_2c18;
  const_reference local_2c10;
  undefined8 local_2c08;
  undefined8 local_2c00;
  undefined8 local_2bf8;
  undefined4 local_2bf0;
  Allocator *local_2be8;
  undefined4 local_2be0;
  undefined4 local_2bdc;
  undefined4 local_2bd8;
  undefined4 local_2bd4;
  undefined4 local_2bd0;
  undefined8 local_2bc8;
  undefined8 local_2bc0;
  undefined8 local_2bb8;
  undefined8 local_2bb0;
  undefined4 local_2ba8;
  Allocator *local_2ba0;
  undefined4 local_2b98;
  undefined4 local_2b94;
  undefined4 local_2b90;
  undefined4 local_2b8c;
  undefined4 local_2b88;
  undefined8 local_2b80;
  int local_2b78;
  int local_2b74;
  undefined8 local_2b70;
  undefined8 local_2b68;
  undefined8 local_2b60;
  undefined4 local_2b58;
  Allocator *local_2b50;
  undefined4 local_2b48;
  undefined4 local_2b44;
  undefined4 local_2b40;
  undefined4 local_2b3c;
  undefined4 local_2b38;
  undefined8 local_2b30;
  undefined8 local_2b28;
  undefined8 local_2b20;
  undefined8 local_2b18;
  undefined4 local_2b10;
  Allocator *local_2b08;
  undefined4 local_2b00;
  undefined4 local_2afc;
  undefined4 local_2af8;
  undefined4 local_2af4;
  undefined4 local_2af0;
  undefined8 local_2ae8;
  float local_2adc;
  float local_2ad8;
  float local_2ad4;
  int local_2ad0;
  int local_2acc;
  undefined1 local_2ac8 [16];
  undefined8 local_2ab8;
  undefined8 local_2ab0;
  undefined8 local_2aa8;
  undefined4 local_2aa0;
  long local_2a98;
  undefined4 local_2a90;
  undefined4 local_2a8c;
  undefined4 local_2a88;
  undefined4 local_2a84;
  undefined4 local_2a80;
  undefined8 local_2a78;
  long local_2a70;
  undefined8 local_2a58;
  undefined8 local_2a50;
  undefined8 local_2a48;
  undefined4 local_2a40;
  long local_2a38;
  undefined4 local_2a30;
  undefined4 local_2a2c;
  undefined4 local_2a28;
  undefined4 local_2a24;
  undefined4 local_2a20;
  undefined8 local_2a18;
  undefined1 (*local_2a10) [16];
  int local_2a04;
  int local_2a00;
  int local_29fc;
  int local_29f8;
  int local_29f4;
  undefined1 (*local_29f0) [16];
  undefined1 local_29e8 [28];
  undefined4 local_29cc;
  undefined4 local_29c8;
  undefined4 local_29c4;
  long local_29c0;
  int local_29b4;
  int local_29b0;
  int local_29ac;
  int local_29a8;
  int local_29a4;
  int local_29a0;
  bool local_299b;
  byte local_299a;
  byte local_2999;
  const_reference local_2998;
  const_reference local_2990;
  int local_2988;
  int local_2984;
  long *local_2980;
  long *local_2978;
  long *local_2970;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2968;
  undefined1 local_295d;
  int local_295c;
  undefined8 *local_2950;
  undefined8 *local_2940;
  undefined8 *local_2930;
  undefined8 *local_2928;
  undefined8 *local_2920;
  undefined8 *local_2918;
  undefined8 *local_2910;
  undefined8 *local_2908;
  undefined8 *local_2900;
  undefined8 *local_28f8;
  undefined8 *local_28d0;
  undefined8 *local_28c0;
  undefined8 *local_28b0;
  undefined8 *local_28a0;
  undefined8 *local_2890;
  undefined8 *local_2880;
  undefined8 *local_2870;
  undefined8 *local_2860;
  undefined8 *local_2840;
  undefined1 local_2825;
  int local_2824;
  const_reference local_2820;
  undefined8 *local_2818;
  undefined1 local_27f5;
  int local_27f4;
  const_reference local_27f0;
  undefined8 *local_27e8;
  undefined1 local_27c5;
  int local_27c4;
  const_reference local_27c0;
  undefined8 *local_27b8;
  undefined1 local_2795;
  int local_2794;
  const_reference local_2790;
  undefined8 *local_2788;
  undefined1 local_2765;
  int local_2764;
  const_reference local_2760;
  undefined8 *local_2758;
  undefined1 local_2735;
  int local_2734;
  const_reference local_2730;
  undefined8 *local_2728;
  undefined1 local_2705;
  int local_2704;
  const_reference local_2700;
  undefined8 *local_26f8;
  undefined1 local_26d5;
  int local_26d4;
  undefined8 *local_26c8;
  int local_26a4;
  undefined8 *local_26a0;
  int local_2694;
  undefined8 *local_2690;
  int local_2684;
  undefined8 *local_2680;
  int local_2674;
  undefined8 *local_2670;
  int local_2664;
  undefined8 *local_2660;
  int local_2654;
  undefined8 *local_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined1 (*local_2638) [16];
  undefined1 (*local_2630) [16];
  undefined1 (*local_2628) [16];
  undefined1 (*local_2620) [16];
  undefined1 *local_2618;
  undefined8 *local_2610;
  undefined1 *local_2608;
  undefined1 *local_2600;
  undefined8 *local_25f8;
  undefined1 *local_25f0;
  undefined1 *local_25e8;
  undefined8 *local_25e0;
  undefined1 *local_25d8;
  undefined1 *local_25d0;
  undefined8 *local_25c8;
  undefined1 *local_25c0;
  undefined1 *local_25b8;
  undefined8 *local_25b0;
  undefined8 *local_25a8;
  undefined1 *local_25a0;
  undefined8 *local_2598;
  undefined8 *local_2590;
  undefined1 *local_2588;
  undefined8 *local_2580;
  undefined8 *local_2578;
  undefined1 *local_2570;
  undefined8 *local_2568;
  undefined8 *local_2560;
  undefined1 *local_2558;
  undefined8 *local_2550;
  undefined8 *local_2548;
  undefined1 *local_2540;
  undefined8 *local_2538;
  undefined8 *local_2530;
  undefined1 *local_2528;
  undefined8 *local_2520;
  undefined8 *local_2518;
  undefined1 *local_2510;
  undefined8 *local_2508;
  undefined8 *local_2500;
  undefined1 *local_24f8;
  undefined8 *local_24f0;
  undefined8 *local_24e8;
  undefined1 *local_24e0;
  undefined8 *local_24d8;
  undefined8 *local_24d0;
  undefined1 *local_24c8;
  undefined8 *local_24c0;
  undefined8 *local_24b8;
  undefined1 *local_24b0;
  undefined8 *local_24a8;
  undefined8 *local_24a0;
  undefined1 *local_2498;
  undefined8 *local_2490;
  undefined8 *local_2488;
  undefined1 *local_2480;
  undefined8 *local_2478;
  undefined8 *local_2470;
  undefined1 *local_2468;
  undefined8 *local_2460;
  undefined8 *local_2458;
  undefined1 *local_2450;
  undefined8 *local_2448;
  undefined8 *local_2440;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 *local_23b0;
  undefined8 *local_23a8;
  long *local_23a0;
  long local_2398;
  undefined4 local_238c;
  long local_2388;
  undefined1 (*local_2380) [16];
  undefined4 local_2374;
  int local_2370;
  int local_236c;
  undefined8 *local_2368;
  Allocator *local_2360;
  int local_2354;
  size_t local_2350;
  void *local_2348;
  int local_233c;
  int local_2338;
  int local_2334;
  undefined8 *local_2330;
  Allocator *local_2328;
  int local_231c;
  size_t local_2318;
  void *local_2310;
  int local_2304;
  int local_2300;
  int local_22fc;
  undefined8 *local_22f8;
  Allocator *local_22f0;
  int local_22e4;
  size_t local_22e0;
  void *local_22d8;
  int local_22cc;
  int local_22c8;
  int local_22c4;
  undefined8 *local_22c0;
  Allocator *local_22b8;
  int local_22ac;
  size_t local_22a8;
  void *local_22a0;
  int local_2294;
  int local_2290;
  int local_228c;
  undefined8 *local_2288;
  Allocator *local_2280;
  int local_2274;
  size_t local_2270;
  void *local_2268;
  int local_225c;
  int local_2258;
  int local_2254;
  undefined8 *local_2250;
  Allocator *local_2248;
  int local_223c;
  size_t local_2238;
  void *local_2230;
  int local_2224;
  int local_2220;
  int local_221c;
  undefined8 *local_2218;
  Allocator *local_2210;
  int local_2204;
  size_t local_2200;
  void *local_21f8;
  int local_21ec;
  int local_21e8;
  int local_21e4;
  undefined8 *local_21e0;
  long local_21d8;
  undefined4 local_21cc;
  long local_21c8;
  long local_21c0;
  undefined4 local_21b4;
  int local_21b0;
  int local_21ac;
  undefined8 *local_21a8;
  undefined4 local_219c;
  long local_2198;
  undefined4 local_218c;
  long local_2188;
  undefined4 local_217c;
  long local_2178;
  undefined4 local_216c;
  long local_2168;
  undefined4 local_215c;
  long local_2158;
  undefined4 local_214c;
  long local_2148;
  undefined4 local_213c;
  long local_2138;
  undefined4 local_212c;
  long local_2128;
  undefined4 local_211c;
  long local_2118;
  undefined8 *local_2110;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  float *local_1ca0;
  float *local_1c98;
  float *local_1c90;
  float *local_1c88;
  float *local_1c80;
  undefined1 (*local_1c78) [16];
  undefined1 (*local_1c70) [16];
  undefined4 local_1c68;
  undefined4 uStack_1c64;
  undefined4 uStack_1c60;
  undefined4 uStack_1c5c;
  undefined4 local_1c54;
  undefined4 *local_1c50;
  undefined4 local_1c48;
  undefined4 uStack_1c44;
  undefined4 uStack_1c40;
  undefined4 uStack_1c3c;
  undefined4 local_1c34;
  undefined4 *local_1c30;
  undefined4 local_1c28;
  undefined4 uStack_1c24;
  undefined4 uStack_1c20;
  undefined4 uStack_1c1c;
  undefined4 local_1c14;
  undefined4 *local_1c10;
  undefined4 local_1c08;
  undefined4 uStack_1c04;
  undefined4 uStack_1c00;
  undefined4 uStack_1bfc;
  undefined4 local_1bf4;
  undefined4 *local_1bf0;
  undefined4 local_1be8;
  undefined4 uStack_1be4;
  undefined4 uStack_1be0;
  undefined4 uStack_1bdc;
  undefined4 local_1bd4;
  undefined4 *local_1bd0;
  undefined4 local_1bc8;
  undefined4 uStack_1bc4;
  undefined4 uStack_1bc0;
  undefined4 uStack_1bbc;
  undefined4 local_1bb4;
  undefined4 *local_1bb0;
  undefined4 local_1ba8;
  undefined4 uStack_1ba4;
  undefined4 uStack_1ba0;
  undefined4 uStack_1b9c;
  undefined4 local_1b94;
  undefined4 *local_1b90;
  undefined4 local_1b88;
  undefined4 uStack_1b84;
  undefined4 uStack_1b80;
  undefined4 uStack_1b7c;
  undefined4 local_1b74;
  undefined4 *local_1b70;
  undefined4 local_1b68;
  undefined4 uStack_1b64;
  undefined4 uStack_1b60;
  undefined4 uStack_1b5c;
  undefined4 local_1b54;
  undefined4 *local_1b50;
  undefined4 local_1b48;
  undefined4 uStack_1b44;
  undefined4 uStack_1b40;
  undefined4 uStack_1b3c;
  undefined4 local_1b34;
  undefined4 *local_1b30;
  undefined4 local_1b28;
  undefined4 uStack_1b24;
  undefined4 uStack_1b20;
  undefined4 uStack_1b1c;
  undefined4 local_1b14;
  undefined4 *local_1b10;
  undefined4 local_1b08;
  undefined4 uStack_1b04;
  undefined4 uStack_1b00;
  undefined4 uStack_1afc;
  undefined4 local_1af4;
  undefined4 *local_1af0;
  undefined4 local_1ae8;
  undefined4 uStack_1ae4;
  undefined4 uStack_1ae0;
  undefined4 uStack_1adc;
  undefined4 local_1ad4;
  undefined4 *local_1ad0;
  undefined4 local_1ac8;
  undefined4 uStack_1ac4;
  undefined4 uStack_1ac0;
  undefined4 uStack_1abc;
  undefined4 local_1ab4;
  undefined4 *local_1ab0;
  undefined4 local_1aa8;
  undefined4 uStack_1aa4;
  undefined4 uStack_1aa0;
  undefined4 uStack_1a9c;
  undefined4 local_1a94;
  undefined4 *local_1a90;
  undefined4 local_1a88;
  undefined4 uStack_1a84;
  undefined4 uStack_1a80;
  undefined4 uStack_1a7c;
  undefined4 local_1a74;
  undefined4 *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined1 local_1a08 [8];
  undefined8 uStack_1a00;
  undefined1 local_19f8 [16];
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  float local_19cc;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  float local_19ac;
  undefined4 local_19a8;
  undefined4 uStack_19a4;
  undefined4 uStack_19a0;
  undefined4 uStack_199c;
  undefined4 local_198c;
  undefined4 local_1988;
  undefined4 uStack_1984;
  undefined4 uStack_1980;
  undefined4 uStack_197c;
  undefined4 local_196c;
  undefined8 local_1968;
  long *local_1960;
  undefined8 local_1958;
  long *local_1950;
  undefined8 local_1948;
  long *local_1940;
  undefined8 local_1938;
  long *local_1930;
  undefined8 local_1928;
  long *local_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 *local_1900;
  undefined8 local_18f8;
  ulong uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  float local_188c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_183c;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined1 local_1828 [16];
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [16];
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined1 local_1798 [16];
  undefined4 local_1788;
  undefined4 uStack_1784;
  undefined4 uStack_1780;
  undefined4 uStack_177c;
  undefined4 local_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined4 local_1758;
  undefined4 uStack_1754;
  undefined4 uStack_1750;
  undefined4 uStack_174c;
  undefined4 local_173c;
  undefined1 local_1738 [8];
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [12];
  float fStack_171c;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined1 local_1708 [8];
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined1 local_16e8 [16];
  undefined1 local_16d8 [16];
  undefined4 local_16c8;
  undefined4 uStack_16c4;
  undefined4 uStack_16c0;
  undefined4 uStack_16bc;
  undefined4 local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined1 local_1698 [8];
  float fStack_1690;
  float fStack_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined1 local_15d8 [16];
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  undefined1 local_15b8 [8];
  float fStack_15b0;
  float fStack_15ac;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined1 local_1598 [16];
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined1 local_1578 [8];
  undefined8 uStack_1570;
  undefined1 local_1568 [16];
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined1 local_1548 [16];
  undefined1 local_1538 [8];
  undefined8 uStack_1530;
  undefined1 local_1528 [8];
  undefined8 uStack_1520;
  undefined1 local_1518 [16];
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined1 *local_14f8;
  undefined1 *local_14f0;
  undefined1 *local_14e8;
  float *local_14e0;
  undefined1 *local_14d8;
  undefined1 *local_14d0;
  float *local_14c8;
  undefined1 *local_14c0;
  undefined1 *local_14b8;
  float *local_14b0;
  undefined1 *local_14a8;
  undefined1 *local_14a0;
  float *local_1498;
  undefined1 *local_1490;
  undefined1 *local_1488;
  float *local_1480;
  undefined1 *local_1478;
  undefined1 *local_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  float local_1408 [2];
  float afStack_1400 [2];
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  float local_13d8 [2];
  float afStack_13d0 [2];
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  float local_13a8 [2];
  float afStack_13a0 [2];
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378 [2];
  float afStack_1370 [2];
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  float local_1348 [2];
  float afStack_1340 [2];
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined4 local_12bc;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined1 local_1218 [8];
  undefined8 uStack_1210;
  undefined1 local_1208 [16];
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [8];
  undefined8 uStack_11d0;
  undefined1 local_11c8 [8];
  undefined8 uStack_11c0;
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 *local_1198;
  undefined1 *local_1190;
  undefined1 *local_1188;
  float *local_1180;
  undefined1 *local_1178;
  undefined1 *local_1170;
  float *local_1168;
  undefined1 *local_1160;
  undefined1 *local_1158;
  float *local_1150;
  undefined1 *local_1148;
  undefined1 *local_1140;
  float *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  float *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  float local_10a8 [2];
  float afStack_10a0 [2];
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  float local_1078 [2];
  float afStack_1070 [2];
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  float local_1048 [2];
  float afStack_1040 [2];
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  float local_1018 [2];
  float afStack_1010 [2];
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  float local_fe8 [2];
  float afStack_fe0 [2];
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined4 local_f5c;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  ulong uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined1 *local_d88;
  float *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  float *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  float *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  float *local_d38;
  undefined1 *local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  float local_cf8 [2];
  float afStack_cf0 [2];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  float local_cc8 [2];
  float afStack_cc0 [2];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  float local_c98 [2];
  float afStack_c90 [2];
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_c68 [2];
  float afStack_c60 [2];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined1 local_bc8 [8];
  float fStack_bc0;
  float fStack_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined4 local_b68;
  undefined4 uStack_b64;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  undefined4 local_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [8];
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [8];
  undefined8 uStack_ab0;
  undefined1 local_aa8 [8];
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  float *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  float *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  float *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined1 local_9d8 [16];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988 [2];
  float afStack_980 [2];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  float local_958 [2];
  float afStack_950 [2];
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928 [2];
  float afStack_920 [2];
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8 [2];
  float afStack_8f0 [2];
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8 [2];
  float afStack_8c0 [2];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined4 local_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 local_758 [16];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined1 *local_6d8;
  float *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  float *local_6b8;
  undefined1 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  float local_688 [2];
  float afStack_680 [2];
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658 [2];
  float afStack_650 [2];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined1 local_5e8 [16];
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined1 *local_598;
  float *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined1 *local_570;
  float *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  float *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  float *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  float *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  float *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  float *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  float *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448 [2];
  float afStack_440 [2];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418 [2];
  float afStack_410 [2];
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8 [2];
  float afStack_3e0 [2];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8 [2];
  float afStack_3b0 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388 [2];
  float afStack_380 [2];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358 [2];
  float afStack_350 [2];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328 [2];
  float afStack_320 [2];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8 [2];
  float afStack_2f0 [2];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288 [2];
  float afStack_280 [2];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 *local_f0;
  float *local_e8;
  float *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8 [2];
  float afStack_c0 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_2988 = in_R9D;
  local_2984 = in_R8D;
  local_2980 = in_RCX;
  local_2978 = in_RDX;
  local_2970 = in_RSI;
  local_2968 = in_RDI;
  local_2990 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDI,0);
  local_2998 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2968,1);
  sVar144 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2968);
  local_2999 = sVar144 == 3;
  local_299a = local_2998->elempack == 1;
  if ((bool)local_2999) {
    pvVar145 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2968,2);
    local_2fb9 = pvVar145->elempack == 1;
  }
  else {
    local_2fb9 = true;
  }
  local_299b = local_2fb9;
  local_29a0 = local_2990->w;
  local_29a4 = local_2990->h;
  local_29a8 = local_2990->c;
  local_29ac = *(int *)((long)local_2970 + 0x2c);
  local_29b0 = (int)local_2970[6];
  local_29b4 = (int)local_2970[7];
  local_23a0 = local_2980;
  local_29c0 = *local_2980;
  local_29c4 = 4;
  local_29c8 = 4;
  local_29cc = 0x10;
  memset(local_29e8,0,0x10);
  local_29f0 = (undefined1 (*) [16])local_29e8;
  for (local_29f4 = 0; local_29f4 < local_29b0; local_29f4 = local_29f4 + 1) {
    for (local_29f8 = 0; local_29f8 < local_29ac; local_29f8 = local_29f8 + 1) {
      local_29fc = local_29f4 * in_stack_00000020 - in_stack_00000030;
      local_2a00 = local_29f8 * in_stack_00000018 - in_stack_00000028;
      for (local_2a04 = 0; local_2a04 < local_29b4; local_2a04 = local_2a04 + 1) {
        local_26c8 = &local_2a58;
        local_236c = *(int *)((long)local_2978 + 0x2c);
        local_2370 = (int)local_2978[6];
        local_2374 = *(undefined4 *)((long)local_2978 + 0x34);
        local_2a10 = (undefined1 (*) [16])
                     (*local_2978 + local_2978[8] * (long)local_2a04 * local_2978[2]);
        local_2388 = local_2978[2];
        local_238c = (undefined4)local_2978[3];
        local_2398 = local_2978[4];
        local_2368 = &local_2a58;
        local_2a38 = local_2398;
        local_2118 = (long)local_236c * (long)local_2370 * local_2388;
        local_23a8 = &local_2a58;
        local_2940 = &local_2a58;
        local_2a58 = 0;
        local_2a48 = 0;
        local_2a40 = 0;
        local_2a2c = 0;
        local_2a28 = 0;
        local_2a24 = 0;
        local_2a20 = 0;
        local_2a50 = 0;
        local_2950 = &local_2ab8;
        local_21ac = *(int *)((long)local_2970 + 0x2c);
        local_21b0 = (int)local_2970[6];
        local_21b4 = *(undefined4 *)((long)local_2970 + 0x34);
        local_2a70 = *local_2970 + local_2970[8] * (long)local_2a04 * local_2970[2];
        local_21c8 = local_2970[2];
        local_21cc = (undefined4)local_2970[3];
        local_21d8 = local_2970[4];
        local_21a8 = &local_2ab8;
        local_2a98 = local_21d8;
        local_2198 = (long)local_21ac * (long)local_21b0 * local_21c8;
        local_2110 = &local_2ab8;
        local_2930 = &local_2ab8;
        local_2a20 = 0;
        local_2a24 = 0;
        local_2a28 = 0;
        local_2a2c = 0;
        local_2a40 = 0;
        local_2a48 = 0;
        local_2a50 = 0;
        local_2a58 = 0;
        local_211c = 0x10;
        local_219c = 0x10;
        local_26d4 = local_2a04;
        local_26d5 = 1;
        local_295c = local_2a04;
        local_295d = 1;
        local_2a18 = 0;
        local_2a30 = 0;
        local_2ab8 = 0;
        local_2aa8 = 0;
        local_2aa0 = 0;
        local_2a90 = 0;
        local_2a8c = 0;
        local_2a88 = 0;
        local_2a84 = 0;
        local_2a80 = 0;
        local_2a78 = 0;
        local_2ab0 = 0;
        local_2648 = 0;
        uStack_2640 = 0;
        local_2ac8 = ZEXT816(0);
        if (local_29c0 != 0) {
          local_1c70 = (undefined1 (*) [16])(local_29c0 + (long)(local_2a04 << 2) * 4);
          local_2ac8 = *local_1c70;
        }
        local_2860 = local_2930;
        local_2840 = local_2940;
        local_2380 = local_2a10;
        local_21c0 = local_2a70;
        for (local_2acc = 0; uVar8 = local_16a8, auVar7 = _local_1728, local_2acc < local_2988;
            local_2acc = local_2acc + 1) {
          for (local_2ad0 = 0; local_2ad0 < local_2984; local_2ad0 = local_2ad0 + 1) {
            if ((local_299a & 1) == 0) {
              local_2b74 = (local_2acc * local_2984 + local_2ad0) * 2;
              local_2b78 = (local_2acc * local_2984 + local_2ad0) * 2 + 1;
              local_2764 = local_2b74 / local_2998->elempack;
              local_2758 = &local_2bc0;
              local_22c4 = local_2998->w;
              local_22c8 = local_2998->h;
              local_22cc = local_2998->d;
              local_22d8 = (void *)((long)local_2998->data +
                                   local_2998->cstep * (long)local_2764 * local_2998->elemsize);
              local_22e0 = local_2998->elemsize;
              local_22e4 = local_2998->elempack;
              local_22f0 = local_2998->allocator;
              local_22c0 = &local_2bc0;
              local_2ba0 = local_22f0;
              local_2148 = (long)local_22c4 * (long)local_22c8 * local_22e0;
              local_2670 = &local_2bc0;
              local_2ad4 = *(float *)((long)local_22d8 +
                                     (long)(local_29f8 * local_2998->elempack +
                                           local_2b74 % local_2998->elempack) * 4 +
                                     (long)local_22c4 * (long)local_29f4 * local_22e0);
              local_2918 = &local_2bc0;
              local_2bc0 = 0;
              local_2bb0 = 0;
              local_2ba8 = 0;
              local_2b94 = 0;
              local_2b90 = 0;
              local_2b8c = 0;
              local_2b88 = 0;
              local_2bb8 = 0;
              local_2794 = local_2b78 / local_2998->elempack;
              local_2788 = &local_2c08;
              local_228c = local_2998->w;
              local_2290 = local_2998->h;
              local_2294 = local_2998->d;
              local_22a0 = (void *)((long)local_2998->data +
                                   local_2998->cstep * (long)local_2794 * local_2998->elemsize);
              local_22a8 = local_2998->elemsize;
              local_22ac = local_2998->elempack;
              local_22b8 = local_2998->allocator;
              local_2288 = &local_2c08;
              local_2be8 = local_22b8;
              local_2158 = (long)local_228c * (long)local_2290 * local_22a8;
              local_2680 = &local_2c08;
              local_2ad8 = *(float *)((long)local_22a0 +
                                     (long)(local_29f8 * local_2998->elempack +
                                           local_2b78 % local_2998->elempack) * 4 +
                                     (long)local_228c * (long)local_29f4 * local_22a8);
              local_2910 = &local_2c08;
              local_2b88 = 0;
              local_2b8c = 0;
              local_2b90 = 0;
              local_2b94 = 0;
              local_2ba8 = 0;
              local_2bb0 = 0;
              local_2bb8 = 0;
              local_2bc0 = 0;
              local_214c = 0x10;
              local_215c = 0x10;
              local_2674 = local_29f4;
              local_2684 = local_29f4;
              local_2760 = local_2998;
              local_2765 = 1;
              local_2790 = local_2998;
              local_2795 = 1;
              local_2b80 = 0;
              local_2b98 = 0;
              local_2c08 = 0;
              local_2bf8 = 0;
              local_2bf0 = 0;
              local_2be0 = 0;
              local_2bdc = 0;
              local_2bd8 = 0;
              local_2bd4 = 0;
              local_2bd0 = 0;
              local_2bc8 = 0;
              local_2c00 = 0;
              local_28a0 = local_2910;
              local_2890 = local_2918;
            }
            else {
              local_2704 = (local_2acc * local_2984 + local_2ad0) * 2;
              local_26f8 = &local_2b28;
              local_2334 = local_2998->w;
              local_2338 = local_2998->h;
              local_233c = local_2998->d;
              local_2348 = (void *)((long)local_2998->data +
                                   local_2998->cstep * (long)local_2704 * local_2998->elemsize);
              local_2350 = local_2998->elemsize;
              local_2354 = local_2998->elempack;
              local_2360 = local_2998->allocator;
              local_2330 = &local_2b28;
              local_2b08 = local_2360;
              local_2128 = (long)local_2334 * (long)local_2338 * local_2350;
              local_2650 = &local_2b28;
              local_2ad4 = *(float *)((long)local_2348 +
                                     (long)local_29f8 * 4 +
                                     (long)local_2334 * (long)local_29f4 * local_2350);
              local_2928 = &local_2b28;
              local_2b28 = 0;
              local_2b18 = 0;
              local_2b10 = 0;
              local_2afc = 0;
              local_2af8 = 0;
              local_2af4 = 0;
              local_2af0 = 0;
              local_2b20 = 0;
              local_2734 = (local_2acc * local_2984 + local_2ad0) * 2 + 1;
              local_2728 = &local_2b70;
              local_22fc = local_2998->w;
              local_2300 = local_2998->h;
              local_2304 = local_2998->d;
              local_2310 = (void *)((long)local_2998->data +
                                   local_2998->cstep * (long)local_2734 * local_2998->elemsize);
              local_2318 = local_2998->elemsize;
              local_231c = local_2998->elempack;
              local_2328 = local_2998->allocator;
              local_22f8 = &local_2b70;
              local_2b50 = local_2328;
              local_2138 = (long)local_22fc * (long)local_2300 * local_2318;
              local_2660 = &local_2b70;
              local_2ad8 = *(float *)((long)local_2310 +
                                     (long)local_29f8 * 4 +
                                     (long)local_22fc * (long)local_29f4 * local_2318);
              local_2920 = &local_2b70;
              local_2af0 = 0;
              local_2af4 = 0;
              local_2af8 = 0;
              local_2afc = 0;
              local_2b10 = 0;
              local_2b18 = 0;
              local_2b20 = 0;
              local_2b28 = 0;
              local_212c = 0x10;
              local_213c = 0x10;
              local_2654 = local_29f4;
              local_2664 = local_29f4;
              local_2700 = local_2998;
              local_2705 = 1;
              local_2730 = local_2998;
              local_2735 = 1;
              local_2ae8 = 0;
              local_2b00 = 0;
              local_2b70 = 0;
              local_2b60 = 0;
              local_2b58 = 0;
              local_2b48 = 0;
              local_2b44 = 0;
              local_2b40 = 0;
              local_2b3c = 0;
              local_2b38 = 0;
              local_2b30 = 0;
              local_2b68 = 0;
              local_2880 = local_2920;
              local_2870 = local_2928;
            }
            local_2adc = 1.0;
            if ((local_2999 & 1) != 0) {
              local_2c10 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                     (local_2968,2);
              if ((local_299b & 1U) == 0) {
                local_2c5c = local_2acc * local_2984 + local_2ad0;
                local_27f4 = local_2c5c / local_2c10->elempack;
                local_27e8 = &local_2ca8;
                local_221c = local_2c10->w;
                local_2220 = local_2c10->h;
                local_2224 = local_2c10->d;
                local_2230 = (void *)((long)local_2c10->data +
                                     local_2c10->cstep * (long)local_27f4 * local_2c10->elemsize);
                local_2238 = local_2c10->elemsize;
                local_223c = local_2c10->elempack;
                local_2248 = local_2c10->allocator;
                local_2218 = &local_2ca8;
                local_2c88 = local_2248;
                local_2178 = (long)local_221c * (long)local_2220 * local_2238;
                local_26a0 = &local_2ca8;
                local_2adc = *(float *)((long)local_2230 +
                                       (long)(local_29f8 * local_2c10->elempack +
                                             local_2c5c % local_2c10->elempack) * 4 +
                                       (long)local_221c * (long)local_29f4 * local_2238);
                local_2900 = &local_2ca8;
                local_217c = 0x10;
                local_26a4 = local_29f4;
                local_27f5 = 1;
                local_2ca8 = 0;
                local_2c98 = 0;
                local_2c90 = 0;
                local_2c80 = 0;
                local_2c7c = 0;
                local_2c78 = 0;
                local_2c74 = 0;
                local_2c70 = 0;
                local_2c68 = 0;
                local_2ca0 = 0;
                local_28c0 = local_2900;
                local_27f0 = local_2c10;
              }
              else {
                local_27c4 = local_2acc * local_2984 + local_2ad0;
                local_27b8 = &local_2c58;
                local_2254 = local_2c10->w;
                local_2258 = local_2c10->h;
                local_225c = local_2c10->d;
                local_2268 = (void *)((long)local_2c10->data +
                                     local_2c10->cstep * (long)local_27c4 * local_2c10->elemsize);
                local_2270 = local_2c10->elemsize;
                local_2274 = local_2c10->elempack;
                local_2280 = local_2c10->allocator;
                local_2250 = &local_2c58;
                local_2c38 = local_2280;
                local_2168 = (long)local_2254 * (long)local_2258 * local_2270;
                local_2690 = &local_2c58;
                local_2adc = *(float *)((long)local_2268 +
                                       (long)local_29f8 * 4 +
                                       (long)local_2254 * (long)local_29f4 * local_2270);
                local_2908 = &local_2c58;
                local_216c = 0x10;
                local_2694 = local_29f4;
                local_27c5 = 1;
                local_2c58 = 0;
                local_2c48 = 0;
                local_2c40 = 0;
                local_2c30 = 0;
                local_2c2c = 0;
                local_2c28 = 0;
                local_2c24 = 0;
                local_2c20 = 0;
                local_2c18 = 0;
                local_2c50 = 0;
                local_28b0 = local_2908;
                local_27c0 = local_2c10;
              }
            }
            local_2cac = (float)(local_29fc + local_2acc * in_stack_00000010) + local_2ad4;
            local_2cb0 = (float)(local_2a00 + local_2ad0 * in_stack_00000008) + local_2ad8;
            local_30e9 = false;
            if (((-1.0 < local_2cac) && (local_30e9 = false, -1.0 < local_2cb0)) &&
               (local_30e9 = false, local_2cac < (float)local_29a4)) {
              local_30e9 = local_2cb0 < (float)local_29a0;
            }
            local_2cb1 = local_30e9;
            local_2cb8 = 0.0;
            local_2cbc = 0.0;
            local_2cc0 = 0.0;
            local_2cc4 = 0.0;
            local_2cc5 = false;
            local_2cc6 = false;
            local_2cc7 = false;
            local_2cc8 = false;
            local_2ccc = 0;
            local_2cd0 = 0;
            local_2cd4 = 0;
            local_2cd8 = 0;
            if (local_30e9 != false) {
              auVar7 = vroundss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)local_2cac),9);
              local_2cdc = (int)auVar7._0_4_;
              auVar7 = vroundss_avx(auVar7,ZEXT416((uint)local_2cb0),9);
              local_2ce0 = (int)auVar7._0_4_;
              local_2ce4 = local_2cdc + 1;
              local_2ce8 = local_2ce0 + 1;
              local_2cec = local_2cac - (float)local_2cdc;
              local_2cf0 = local_2cb0 - (float)local_2ce0;
              local_2cf4 = 1.0 - local_2cec;
              local_2cf8 = 1.0 - local_2cf0;
              local_30ea = -1 < local_2cdc && -1 < local_2ce0;
              local_2cc5 = local_30ea;
              bVar1 = local_2ce8 <= local_29a0 + -1;
              local_30eb = -1 < local_2cdc && bVar1;
              local_2cc6 = local_30eb;
              bVar3 = local_2ce4 <= local_29a4 + -1;
              local_30ec = bVar3 && -1 < local_2ce0;
              local_2cc7 = local_30ec;
              bVar4 = local_2ce4 <= local_29a4 + -1;
              bVar2 = local_2ce8 <= local_29a0 + -1;
              local_30ed = bVar4 && bVar2;
              local_2cc8 = local_30ed;
              if (-1 < local_2cdc && -1 < local_2ce0) {
                local_2ccc = local_2cdc * local_29a0 + local_2ce0;
              }
              if (-1 < local_2cdc && bVar1) {
                local_2cd0 = local_2cdc * local_29a0 + local_2ce8;
              }
              if (bVar3 && -1 < local_2ce0) {
                local_2cd4 = local_2ce4 * local_29a0 + local_2ce0;
              }
              if (bVar4 && bVar2) {
                local_2cd8 = local_2ce4 * local_29a0 + local_2ce8;
              }
              local_2cb8 = local_2cf4 * local_2cf8;
              local_2cbc = local_2cf4 * local_2cf0;
              local_2cc0 = local_2cec * local_2cf8;
              local_2cc4 = local_2cec * local_2cf0;
            }
            local_2d08 = local_2cb8;
            fStack_2d04 = local_2cb8;
            fStack_2d00 = local_2cb8;
            fStack_2cfc = local_2cb8;
            local_2d10 = &local_2d08;
            local_2d28 = local_2cbc;
            fStack_2d24 = local_2cbc;
            fStack_2d20 = local_2cbc;
            fStack_2d1c = local_2cbc;
            local_2d30 = &local_2d28;
            local_2d48 = local_2cc0;
            fStack_2d44 = local_2cc0;
            fStack_2d40 = local_2cc0;
            fStack_2d3c = local_2cc0;
            local_2d50 = &local_2d48;
            local_2d68 = local_2cc4;
            fStack_2d64 = local_2cc4;
            fStack_2d60 = local_2cc4;
            fStack_2d5c = local_2cc4;
            local_2d70 = &local_2d68;
            local_2d88 = local_2adc;
            fStack_2d84 = local_2adc;
            fStack_2d80 = local_2adc;
            fStack_2d7c = local_2adc;
            local_2d90 = &local_2d88;
            for (local_2d94 = 0; local_2d94 < local_29a8; local_2d94 = local_2d94 + 1) {
              local_2818 = &local_2de8;
              local_21e4 = local_2990->w;
              local_21e8 = local_2990->h;
              local_21ec = local_2990->d;
              local_2da0 = (void *)((long)local_2990->data +
                                   local_2990->cstep * (long)local_2d94 * local_2990->elemsize);
              local_2200 = local_2990->elemsize;
              local_2204 = local_2990->elempack;
              local_2210 = local_2990->allocator;
              local_21e0 = &local_2de8;
              local_2188 = (long)local_21e4 * (long)local_21e8 * local_2200;
              local_218c = 0x10;
              local_2820 = local_2990;
              local_2824 = local_2d94;
              local_2825 = 1;
              local_23b0 = &local_2de8;
              local_28f8 = &local_2de8;
              local_2de8 = 0;
              local_2dd8 = 0;
              local_2dd0 = 0;
              local_2dc0 = 0;
              local_2dbc = 0;
              local_2db8 = 0;
              local_2db4 = 0;
              local_2db0 = 0;
              local_2da8 = 0;
              local_2de0 = 0;
              local_1c78 = local_29f0;
              uVar8 = *(undefined8 *)*local_29f0;
              uVar9 = *(undefined8 *)(*local_29f0 + 8);
              _local_2e08 = *local_29f0;
              _local_2e28 = *local_29f0;
              _local_2e18 = *local_29f0;
              _local_2df8 = *local_29f0;
              if (local_30e9 != false) {
                local_2e68 = uVar8;
                uStack_2e60 = uVar9;
                local_2e58 = uVar8;
                uStack_2e50 = uVar9;
                local_2e48 = uVar8;
                uStack_2e40 = uVar9;
                local_2e38 = uVar8;
                uStack_2e30 = uVar9;
                if (local_2cc5 != false) {
                  local_1a70 = (undefined4 *)((long)local_2da0 + (long)(local_2ccc << 2) * 4);
                  local_1a88 = *local_1a70;
                  local_2e38 = CONCAT44(local_1a88,local_1a88);
                  uStack_2e30 = CONCAT44(local_1a88,local_1a88);
                  local_1a90 = (undefined4 *)((long)local_2da0 + (long)(local_2ccc << 2) * 4 + 4);
                  local_1aa8 = *local_1a90;
                  local_2e48 = CONCAT44(local_1aa8,local_1aa8);
                  uStack_2e40 = CONCAT44(local_1aa8,local_1aa8);
                  local_1ab0 = (undefined4 *)((long)local_2da0 + (long)(local_2ccc << 2) * 4 + 8);
                  local_1ac8 = *local_1ab0;
                  local_2e58 = CONCAT44(local_1ac8,local_1ac8);
                  uStack_2e50 = CONCAT44(local_1ac8,local_1ac8);
                  local_1ad0 = (undefined4 *)((long)local_2da0 + (long)(local_2ccc << 2) * 4 + 0xc);
                  local_1ae8 = *local_1ad0;
                  local_2e68 = CONCAT44(local_1ae8,local_1ae8);
                  uStack_2e60 = CONCAT44(local_1ae8,local_1ae8);
                  uStack_1ae4 = local_1ae8;
                  uStack_1ae0 = local_1ae8;
                  uStack_1adc = local_1ae8;
                  local_1ad4 = local_1ae8;
                  uStack_1ac4 = local_1ac8;
                  uStack_1ac0 = local_1ac8;
                  uStack_1abc = local_1ac8;
                  local_1ab4 = local_1ac8;
                  uStack_1aa4 = local_1aa8;
                  uStack_1aa0 = local_1aa8;
                  uStack_1a9c = local_1aa8;
                  local_1a94 = local_1aa8;
                  uStack_1a84 = local_1a88;
                  uStack_1a80 = local_1a88;
                  uStack_1a7c = local_1a88;
                  local_1a74 = local_1a88;
                }
                local_2ea8 = uVar8;
                uStack_2ea0 = uVar9;
                local_2e98 = uVar8;
                uStack_2e90 = uVar9;
                local_2e88 = uVar8;
                uStack_2e80 = uVar9;
                local_2e78 = uVar8;
                uStack_2e70 = uVar9;
                if (local_2cc6 != false) {
                  local_1af0 = (undefined4 *)((long)local_2da0 + (long)(local_2cd0 << 2) * 4);
                  local_1b08 = *local_1af0;
                  local_2e78 = CONCAT44(local_1b08,local_1b08);
                  uStack_2e70 = CONCAT44(local_1b08,local_1b08);
                  local_1b10 = (undefined4 *)((long)local_2da0 + (long)(local_2cd0 << 2) * 4 + 4);
                  local_1b28 = *local_1b10;
                  local_2e88 = CONCAT44(local_1b28,local_1b28);
                  uStack_2e80 = CONCAT44(local_1b28,local_1b28);
                  local_1b30 = (undefined4 *)((long)local_2da0 + (long)(local_2cd0 << 2) * 4 + 8);
                  local_1b48 = *local_1b30;
                  local_2e98 = CONCAT44(local_1b48,local_1b48);
                  uStack_2e90 = CONCAT44(local_1b48,local_1b48);
                  local_1b50 = (undefined4 *)((long)local_2da0 + (long)(local_2cd0 << 2) * 4 + 0xc);
                  local_1b68 = *local_1b50;
                  local_2ea8 = CONCAT44(local_1b68,local_1b68);
                  uStack_2ea0 = CONCAT44(local_1b68,local_1b68);
                  uStack_1b64 = local_1b68;
                  uStack_1b60 = local_1b68;
                  uStack_1b5c = local_1b68;
                  local_1b54 = local_1b68;
                  uStack_1b44 = local_1b48;
                  uStack_1b40 = local_1b48;
                  uStack_1b3c = local_1b48;
                  local_1b34 = local_1b48;
                  uStack_1b24 = local_1b28;
                  uStack_1b20 = local_1b28;
                  uStack_1b1c = local_1b28;
                  local_1b14 = local_1b28;
                  uStack_1b04 = local_1b08;
                  uStack_1b00 = local_1b08;
                  uStack_1afc = local_1b08;
                  local_1af4 = local_1b08;
                }
                local_2ee8 = uVar8;
                uStack_2ee0 = uVar9;
                local_2ed8 = uVar8;
                uStack_2ed0 = uVar9;
                local_2ec8 = uVar8;
                uStack_2ec0 = uVar9;
                local_2eb8 = uVar8;
                uStack_2eb0 = uVar9;
                if (local_2cc7 != false) {
                  local_1b70 = (undefined4 *)((long)local_2da0 + (long)(local_2cd4 << 2) * 4);
                  local_1b88 = *local_1b70;
                  local_2eb8 = CONCAT44(local_1b88,local_1b88);
                  uStack_2eb0 = CONCAT44(local_1b88,local_1b88);
                  local_1b90 = (undefined4 *)((long)local_2da0 + (long)(local_2cd4 << 2) * 4 + 4);
                  local_1ba8 = *local_1b90;
                  local_2ec8 = CONCAT44(local_1ba8,local_1ba8);
                  uStack_2ec0 = CONCAT44(local_1ba8,local_1ba8);
                  local_1bb0 = (undefined4 *)((long)local_2da0 + (long)(local_2cd4 << 2) * 4 + 8);
                  local_1bc8 = *local_1bb0;
                  local_2ed8 = CONCAT44(local_1bc8,local_1bc8);
                  uStack_2ed0 = CONCAT44(local_1bc8,local_1bc8);
                  local_1bd0 = (undefined4 *)((long)local_2da0 + (long)(local_2cd4 << 2) * 4 + 0xc);
                  local_1be8 = *local_1bd0;
                  local_2ee8 = CONCAT44(local_1be8,local_1be8);
                  uStack_2ee0 = CONCAT44(local_1be8,local_1be8);
                  uStack_1be4 = local_1be8;
                  uStack_1be0 = local_1be8;
                  uStack_1bdc = local_1be8;
                  local_1bd4 = local_1be8;
                  uStack_1bc4 = local_1bc8;
                  uStack_1bc0 = local_1bc8;
                  uStack_1bbc = local_1bc8;
                  local_1bb4 = local_1bc8;
                  uStack_1ba4 = local_1ba8;
                  uStack_1ba0 = local_1ba8;
                  uStack_1b9c = local_1ba8;
                  local_1b94 = local_1ba8;
                  uStack_1b84 = local_1b88;
                  uStack_1b80 = local_1b88;
                  uStack_1b7c = local_1b88;
                  local_1b74 = local_1b88;
                }
                local_2f28 = uVar8;
                uStack_2f20 = uVar9;
                local_2f18 = uVar8;
                uStack_2f10 = uVar9;
                local_2f08 = uVar8;
                uStack_2f00 = uVar9;
                local_2ef8 = uVar8;
                uStack_2ef0 = uVar9;
                if (local_2cc8 != false) {
                  local_1bf0 = (undefined4 *)((long)local_2da0 + (long)(local_2cd8 << 2) * 4);
                  local_1c08 = *local_1bf0;
                  local_2ef8 = CONCAT44(local_1c08,local_1c08);
                  uStack_2ef0 = CONCAT44(local_1c08,local_1c08);
                  local_1c10 = (undefined4 *)((long)local_2da0 + (long)(local_2cd8 << 2) * 4 + 4);
                  local_1c28 = *local_1c10;
                  local_2f08 = CONCAT44(local_1c28,local_1c28);
                  uStack_2f00 = CONCAT44(local_1c28,local_1c28);
                  local_1c30 = (undefined4 *)((long)local_2da0 + (long)(local_2cd8 << 2) * 4 + 8);
                  local_1c48 = *local_1c30;
                  local_2f18 = CONCAT44(local_1c48,local_1c48);
                  uStack_2f10 = CONCAT44(local_1c48,local_1c48);
                  local_1c50 = (undefined4 *)((long)local_2da0 + (long)(local_2cd8 << 2) * 4 + 0xc);
                  local_1c68 = *local_1c50;
                  local_2f28 = CONCAT44(local_1c68,local_1c68);
                  uStack_2f20 = CONCAT44(local_1c68,local_1c68);
                  uStack_1c64 = local_1c68;
                  uStack_1c60 = local_1c68;
                  uStack_1c5c = local_1c68;
                  local_1c54 = local_1c68;
                  uStack_1c44 = local_1c48;
                  uStack_1c40 = local_1c48;
                  uStack_1c3c = local_1c48;
                  local_1c34 = local_1c48;
                  uStack_1c24 = local_1c28;
                  uStack_1c20 = local_1c28;
                  uStack_1c1c = local_1c28;
                  local_1c14 = local_1c28;
                  uStack_1c04 = local_1c08;
                  uStack_1c00 = local_1c08;
                  uStack_1bfc = local_1c08;
                  local_1bf4 = local_1c08;
                }
                local_2f38 = CONCAT44(local_2cb8,local_2cb8);
                uStack_2f30 = CONCAT44(local_2cb8,local_2cb8);
                auVar113._4_4_ = local_2cb8;
                auVar113._0_4_ = local_2cb8;
                auVar113._8_4_ = local_2cb8;
                auVar113._12_4_ = local_2cb8;
                auVar112._4_4_ = local_2cb8;
                auVar112._0_4_ = local_2cb8;
                auVar112._8_4_ = local_2cb8;
                auVar112._12_4_ = local_2cb8;
                auVar111._4_4_ = local_2cb8;
                auVar111._0_4_ = local_2cb8;
                auVar111._8_4_ = local_2cb8;
                auVar111._12_4_ = local_2cb8;
                auVar110._4_4_ = local_2cb8;
                auVar110._0_4_ = local_2cb8;
                auVar110._8_4_ = local_2cb8;
                auVar110._12_4_ = local_2cb8;
                local_2f48 = CONCAT44(local_2cbc,local_2cbc);
                uStack_2f40 = CONCAT44(local_2cbc,local_2cbc);
                auVar109._4_4_ = local_2cbc;
                auVar109._0_4_ = local_2cbc;
                auVar109._8_4_ = local_2cbc;
                auVar109._12_4_ = local_2cbc;
                auVar108._4_4_ = local_2cbc;
                auVar108._0_4_ = local_2cbc;
                auVar108._8_4_ = local_2cbc;
                auVar108._12_4_ = local_2cbc;
                auVar107._4_4_ = local_2cbc;
                auVar107._0_4_ = local_2cbc;
                auVar107._8_4_ = local_2cbc;
                auVar107._12_4_ = local_2cbc;
                auVar106._4_4_ = local_2cbc;
                auVar106._0_4_ = local_2cbc;
                auVar106._8_4_ = local_2cbc;
                auVar106._12_4_ = local_2cbc;
                local_2f58 = CONCAT44(local_2cc0,local_2cc0);
                uStack_2f50 = CONCAT44(local_2cc0,local_2cc0);
                auVar105._4_4_ = local_2cc0;
                auVar105._0_4_ = local_2cc0;
                auVar105._8_4_ = local_2cc0;
                auVar105._12_4_ = local_2cc0;
                auVar104._4_4_ = local_2cc0;
                auVar104._0_4_ = local_2cc0;
                auVar104._8_4_ = local_2cc0;
                auVar104._12_4_ = local_2cc0;
                auVar103._4_4_ = local_2cc0;
                auVar103._0_4_ = local_2cc0;
                auVar103._8_4_ = local_2cc0;
                auVar103._12_4_ = local_2cc0;
                auVar102._4_4_ = local_2cc0;
                auVar102._0_4_ = local_2cc0;
                auVar102._8_4_ = local_2cc0;
                auVar102._12_4_ = local_2cc0;
                local_2f68 = CONCAT44(local_2cc4,local_2cc4);
                uStack_2f60 = CONCAT44(local_2cc4,local_2cc4);
                auVar101._4_4_ = local_2cc4;
                auVar101._0_4_ = local_2cc4;
                auVar101._8_4_ = local_2cc4;
                auVar101._12_4_ = local_2cc4;
                auVar100._4_4_ = local_2cc4;
                auVar100._0_4_ = local_2cc4;
                auVar100._8_4_ = local_2cc4;
                auVar100._12_4_ = local_2cc4;
                auVar99._4_4_ = local_2cc4;
                auVar99._0_4_ = local_2cc4;
                auVar99._8_4_ = local_2cc4;
                auVar99._12_4_ = local_2cc4;
                auVar98._4_4_ = local_2cc4;
                auVar98._0_4_ = local_2cc4;
                auVar98._8_4_ = local_2cc4;
                auVar98._12_4_ = local_2cc4;
                local_2440 = &local_2e38;
                local_2448 = &local_2f38;
                local_2450 = local_2df8;
                local_2048 = local_2e38;
                uStack_2040 = uStack_2e30;
                auVar94._8_8_ = uStack_2e30;
                auVar94._0_8_ = local_2e38;
                local_2068 = local_2df8;
                uStack_2060 = uStack_2df0;
                auVar7 = vfmadd213ps_fma(auVar110,auVar94,_local_2df8);
                local_2458 = &local_2e78;
                local_2460 = &local_2f48;
                local_2468 = local_2df8;
                local_2018 = local_2e78;
                uStack_2010 = uStack_2e70;
                auVar91._8_8_ = uStack_2e70;
                auVar91._0_8_ = local_2e78;
                local_2df8 = auVar7._0_8_;
                local_2038 = local_2df8;
                uStack_2df0 = auVar7._8_8_;
                uStack_2030 = uStack_2df0;
                auVar7 = vfmadd213ps_fma(auVar106,auVar91,auVar7);
                local_2470 = &local_2eb8;
                local_2478 = &local_2f58;
                local_2480 = local_2df8;
                local_1fe8 = local_2eb8;
                uStack_1fe0 = uStack_2eb0;
                auVar87._8_8_ = uStack_2eb0;
                auVar87._0_8_ = local_2eb8;
                local_2df8 = auVar7._0_8_;
                local_2008 = local_2df8;
                uStack_2df0 = auVar7._8_8_;
                uStack_2000 = uStack_2df0;
                auVar7 = vfmadd213ps_fma(auVar102,auVar87,auVar7);
                local_2488 = &local_2ef8;
                local_2490 = &local_2f68;
                local_2498 = local_2df8;
                local_1fb8 = local_2ef8;
                uStack_1fb0 = uStack_2ef0;
                auVar83._8_8_ = uStack_2ef0;
                auVar83._0_8_ = local_2ef8;
                local_2df8 = auVar7._0_8_;
                local_1fd8 = local_2df8;
                uStack_2df0 = auVar7._8_8_;
                uStack_1fd0 = uStack_2df0;
                _local_2df8 = vfmadd213ps_fma(auVar98,auVar83,auVar7);
                local_24a0 = &local_2e48;
                local_24a8 = &local_2f38;
                local_24b0 = local_2e08;
                local_1f88 = local_2e48;
                uStack_1f80 = uStack_2e40;
                auVar93._8_8_ = uStack_2e40;
                auVar93._0_8_ = local_2e48;
                local_1fa8 = local_2e08;
                uStack_1fa0 = uStack_2e00;
                auVar7 = vfmadd213ps_fma(auVar111,auVar93,_local_2e08);
                local_24b8 = &local_2e88;
                local_24c0 = &local_2f48;
                local_24c8 = local_2e08;
                local_1f58 = local_2e88;
                uStack_1f50 = uStack_2e80;
                auVar90._8_8_ = uStack_2e80;
                auVar90._0_8_ = local_2e88;
                local_2e08 = auVar7._0_8_;
                local_1f78 = local_2e08;
                uStack_2e00 = auVar7._8_8_;
                uStack_1f70 = uStack_2e00;
                auVar7 = vfmadd213ps_fma(auVar107,auVar90,auVar7);
                local_24d0 = &local_2ec8;
                local_24d8 = &local_2f58;
                local_24e0 = local_2e08;
                local_1f28 = local_2ec8;
                uStack_1f20 = uStack_2ec0;
                auVar86._8_8_ = uStack_2ec0;
                auVar86._0_8_ = local_2ec8;
                local_2e08 = auVar7._0_8_;
                local_1f48 = local_2e08;
                uStack_2e00 = auVar7._8_8_;
                uStack_1f40 = uStack_2e00;
                auVar7 = vfmadd213ps_fma(auVar103,auVar86,auVar7);
                local_24e8 = &local_2f08;
                local_24f0 = &local_2f68;
                local_24f8 = local_2e08;
                local_1ef8 = local_2f08;
                uStack_1ef0 = uStack_2f00;
                auVar82._8_8_ = uStack_2f00;
                auVar82._0_8_ = local_2f08;
                local_2e08 = auVar7._0_8_;
                local_1f18 = local_2e08;
                uStack_2e00 = auVar7._8_8_;
                uStack_1f10 = uStack_2e00;
                _local_2e08 = vfmadd213ps_fma(auVar99,auVar82,auVar7);
                local_2500 = &local_2e58;
                local_2508 = &local_2f38;
                local_2510 = local_2e18;
                local_1ec8 = local_2e58;
                uStack_1ec0 = uStack_2e50;
                auVar92._8_8_ = uStack_2e50;
                auVar92._0_8_ = local_2e58;
                local_1ee8 = local_2e18;
                uStack_1ee0 = uStack_2e10;
                auVar7 = vfmadd213ps_fma(auVar112,auVar92,_local_2e18);
                local_2518 = &local_2e98;
                local_2520 = &local_2f48;
                local_2528 = local_2e18;
                local_1e98 = local_2e98;
                uStack_1e90 = uStack_2e90;
                auVar89._8_8_ = uStack_2e90;
                auVar89._0_8_ = local_2e98;
                local_2e18 = auVar7._0_8_;
                local_1eb8 = local_2e18;
                uStack_2e10 = auVar7._8_8_;
                uStack_1eb0 = uStack_2e10;
                auVar7 = vfmadd213ps_fma(auVar108,auVar89,auVar7);
                local_2530 = &local_2ed8;
                local_2538 = &local_2f58;
                local_2540 = local_2e18;
                local_1e68 = local_2ed8;
                uStack_1e60 = uStack_2ed0;
                auVar85._8_8_ = uStack_2ed0;
                auVar85._0_8_ = local_2ed8;
                local_2e18 = auVar7._0_8_;
                local_1e88 = local_2e18;
                uStack_2e10 = auVar7._8_8_;
                uStack_1e80 = uStack_2e10;
                auVar7 = vfmadd213ps_fma(auVar104,auVar85,auVar7);
                local_2548 = &local_2f18;
                local_2550 = &local_2f68;
                local_2558 = local_2e18;
                local_1e38 = local_2f18;
                uStack_1e30 = uStack_2f10;
                auVar6._8_8_ = uStack_2f10;
                auVar6._0_8_ = local_2f18;
                local_2e18 = auVar7._0_8_;
                local_1e58 = local_2e18;
                uStack_2e10 = auVar7._8_8_;
                uStack_1e50 = uStack_2e10;
                _local_2e18 = vfmadd213ps_fma(auVar100,auVar6,auVar7);
                local_2560 = &local_2e68;
                local_2568 = &local_2f38;
                local_2570 = local_2e28;
                local_1e08 = local_2e68;
                uStack_1e00 = uStack_2e60;
                auVar7._8_8_ = uStack_2e60;
                auVar7._0_8_ = local_2e68;
                local_1e28 = local_2e28;
                uStack_1e20 = uStack_2e20;
                auVar7 = vfmadd213ps_fma(auVar113,auVar7,_local_2e28);
                local_2578 = &local_2ea8;
                local_2580 = &local_2f48;
                local_2588 = local_2e28;
                local_1dd8 = local_2ea8;
                uStack_1dd0 = uStack_2ea0;
                auVar88._8_8_ = uStack_2ea0;
                auVar88._0_8_ = local_2ea8;
                local_2e28 = auVar7._0_8_;
                local_1df8 = local_2e28;
                uStack_2e20 = auVar7._8_8_;
                uStack_1df0 = uStack_2e20;
                auVar7 = vfmadd213ps_fma(auVar109,auVar88,auVar7);
                local_2590 = &local_2ee8;
                local_2598 = &local_2f58;
                local_25a0 = local_2e28;
                local_1da8 = local_2ee8;
                uStack_1da0 = uStack_2ee0;
                auVar84._8_8_ = uStack_2ee0;
                auVar84._0_8_ = local_2ee8;
                local_2e28 = auVar7._0_8_;
                local_1dc8 = local_2e28;
                uStack_2e20 = auVar7._8_8_;
                uStack_1dc0 = uStack_2e20;
                auVar7 = vfmadd213ps_fma(auVar105,auVar84,auVar7);
                local_25a8 = &local_2f28;
                local_25b0 = &local_2f68;
                local_25b8 = local_2e28;
                local_1d78 = local_2f28;
                uStack_1d70 = uStack_2f20;
                auVar5._8_8_ = uStack_2f20;
                auVar5._0_8_ = local_2f28;
                local_2e28 = auVar7._0_8_;
                local_1d98 = local_2e28;
                uStack_2e20 = auVar7._8_8_;
                uStack_1d90 = uStack_2e20;
                _local_2e28 = vfmadd213ps_fma(auVar101,auVar5,auVar7);
                local_2058 = local_2f38;
                uStack_2050 = uStack_2f30;
                local_2028 = local_2f48;
                uStack_2020 = uStack_2f40;
                local_1ff8 = local_2f58;
                uStack_1ff0 = uStack_2f50;
                local_1fc8 = local_2f68;
                uStack_1fc0 = uStack_2f60;
                local_1f98 = local_2f38;
                uStack_1f90 = uStack_2f30;
                local_1f68 = local_2f48;
                uStack_1f60 = uStack_2f40;
                local_1f38 = local_2f58;
                uStack_1f30 = uStack_2f50;
                local_1f08 = local_2f68;
                uStack_1f00 = uStack_2f60;
                local_1ed8 = local_2f38;
                uStack_1ed0 = uStack_2f30;
                local_1ea8 = local_2f48;
                uStack_1ea0 = uStack_2f40;
                local_1e78 = local_2f58;
                uStack_1e70 = uStack_2f50;
                local_1e48 = local_2f68;
                uStack_1e40 = uStack_2f60;
                local_1e18 = local_2f38;
                uStack_1e10 = uStack_2f30;
                local_1de8 = local_2f48;
                uStack_1de0 = uStack_2f40;
                local_1db8 = local_2f58;
                uStack_1db0 = uStack_2f50;
                local_1d88 = local_2f68;
                uStack_1d80 = uStack_2f60;
                local_1c98 = local_2d70;
                local_1c90 = local_2d50;
                local_1c88 = local_2d30;
                local_1c80 = local_2d10;
              }
              if ((local_2999 & 1) != 0) {
                local_2f78 = CONCAT44(local_2adc,local_2adc);
                uStack_2f70 = CONCAT44(local_2adc,local_2adc);
                local_23c8 = local_2df8;
                uVar118 = local_23c8;
                uStack_23c0 = uStack_2df0;
                uVar119 = uStack_23c0;
                local_23c8._0_4_ = local_2df8._0_4_;
                local_23c8._4_4_ = local_2df8._4_4_;
                uStack_23c0._0_4_ = local_2df8._8_4_;
                uStack_23c0._4_4_ = local_2df8._12_4_;
                local_2df8._4_4_ = local_23c8._4_4_ * local_2adc;
                local_2df8._0_4_ = (float)local_23c8 * local_2adc;
                uStack_2df0._0_4_ = (float)uStack_23c0 * local_2adc;
                uStack_2df0._4_4_ = uStack_23c0._4_4_ * local_2adc;
                local_23e8 = local_2e08;
                uVar116 = local_23e8;
                uStack_23e0 = uStack_2e00;
                uVar117 = uStack_23e0;
                local_23e8._0_4_ = local_2e08._0_4_;
                local_23e8._4_4_ = local_2e08._4_4_;
                uStack_23e0._0_4_ = local_2e08._8_4_;
                uStack_23e0._4_4_ = local_2e08._12_4_;
                local_2e08._4_4_ = local_23e8._4_4_ * local_2adc;
                local_2e08._0_4_ = (float)local_23e8 * local_2adc;
                uStack_2e00._0_4_ = (float)uStack_23e0 * local_2adc;
                uStack_2e00._4_4_ = uStack_23e0._4_4_ * local_2adc;
                local_2408 = local_2e18;
                uVar114 = local_2408;
                uStack_2400 = uStack_2e10;
                uVar115 = uStack_2400;
                local_2408._0_4_ = local_2e18._0_4_;
                local_2408._4_4_ = local_2e18._4_4_;
                uStack_2400._0_4_ = local_2e18._8_4_;
                uStack_2400._4_4_ = local_2e18._12_4_;
                local_2e18._4_4_ = local_2408._4_4_ * local_2adc;
                local_2e18._0_4_ = (float)local_2408 * local_2adc;
                uStack_2e10._0_4_ = (float)uStack_2400 * local_2adc;
                uStack_2e10._4_4_ = uStack_2400._4_4_ * local_2adc;
                local_2428 = local_2e28;
                uVar8 = local_2428;
                uStack_2420 = uStack_2e20;
                uVar9 = uStack_2420;
                local_2428._0_4_ = local_2e28._0_4_;
                local_2428._4_4_ = local_2e28._4_4_;
                uStack_2420._0_4_ = local_2e28._8_4_;
                uStack_2420._4_4_ = local_2e28._12_4_;
                local_2e28._4_4_ = local_2428._4_4_ * local_2adc;
                local_2e28._0_4_ = (float)local_2428 * local_2adc;
                uStack_2e20._0_4_ = (float)uStack_2420 * local_2adc;
                uStack_2e20._4_4_ = uStack_2420._4_4_ * local_2adc;
                local_2438 = local_2f78;
                uStack_2430 = uStack_2f70;
                local_2428 = uVar8;
                uStack_2420 = uVar9;
                local_2418 = local_2f78;
                uStack_2410 = uStack_2f70;
                local_2408 = uVar114;
                uStack_2400 = uVar115;
                local_23f8 = local_2f78;
                uStack_23f0 = uStack_2f70;
                local_23e8 = uVar116;
                uStack_23e0 = uVar117;
                local_23d8 = local_2f78;
                uStack_23d0 = uStack_2f70;
                local_23c8 = uVar118;
                uStack_23c0 = uVar119;
                local_1ca0 = local_2d90;
              }
              local_2620 = local_2a10;
              local_2f88 = *(undefined8 *)*local_2a10;
              uStack_2f80 = *(undefined8 *)(*local_2a10 + 8);
              local_2628 = local_2a10 + 1;
              local_2f98 = *(undefined8 *)*local_2628;
              uStack_2f90 = *(undefined8 *)(local_2a10[1] + 8);
              local_25c0 = local_2df8;
              local_25c8 = &local_2f88;
              local_25d0 = local_2ac8;
              local_1d48 = local_2df8;
              uStack_1d40 = uStack_2df0;
              local_1d68 = local_2ac8._0_8_;
              uStack_1d60 = local_2ac8._8_8_;
              auVar7 = vfmadd213ps_fma(*local_2a10,_local_2df8,local_2ac8);
              local_25d8 = local_2e08;
              local_25e0 = &local_2f98;
              local_25e8 = local_2ac8;
              local_1d18 = local_2e08;
              uStack_1d10 = uStack_2e00;
              local_2ac8._0_8_ = auVar7._0_8_;
              local_1d38 = local_2ac8._0_8_;
              local_2ac8._8_8_ = auVar7._8_8_;
              uStack_1d30 = local_2ac8._8_8_;
              auVar7 = vfmadd213ps_fma(*local_2628,_local_2e08,auVar7);
              local_2630 = local_2a10 + 2;
              local_2fa8 = *(undefined8 *)*local_2630;
              uStack_2fa0 = *(undefined8 *)(local_2a10[2] + 8);
              local_2638 = local_2a10 + 3;
              local_2fb8 = *(undefined8 *)*local_2638;
              uStack_2fb0 = *(undefined8 *)(local_2a10[3] + 8);
              local_25f0 = local_2e18;
              local_25f8 = &local_2fa8;
              local_2600 = local_2ac8;
              local_1ce8 = local_2e18;
              uStack_1ce0 = uStack_2e10;
              local_2ac8._0_8_ = auVar7._0_8_;
              local_1d08 = local_2ac8._0_8_;
              local_2ac8._8_8_ = auVar7._8_8_;
              uStack_1d00 = local_2ac8._8_8_;
              auVar7 = vfmadd213ps_fma(*local_2630,_local_2e18,auVar7);
              local_2608 = local_2e28;
              local_2610 = &local_2fb8;
              local_2618 = local_2ac8;
              local_1cb8 = local_2e28;
              uStack_1cb0 = uStack_2e20;
              local_2ac8._0_8_ = auVar7._0_8_;
              local_1cd8 = local_2ac8._0_8_;
              local_2ac8._8_8_ = auVar7._8_8_;
              uStack_1cd0 = local_2ac8._8_8_;
              local_2ac8 = vfmadd213ps_fma(*local_2638,_local_2e28,auVar7);
              local_2a10 = local_2a10 + 4;
              local_28d0 = local_28f8;
              local_21f8 = local_2da0;
              local_1d58 = local_2f88;
              uStack_1d50 = uStack_2f80;
              local_1d28 = local_2f98;
              uStack_1d20 = uStack_2f90;
              local_1cf8 = local_2fa8;
              uStack_1cf0 = uStack_2fa0;
              local_1cc8 = local_2fb8;
              uStack_1cc0 = uStack_2fb0;
              local_2dc8 = local_2210;
            }
          }
        }
        local_1a18 = local_2ac8._0_8_;
        uStack_1a10 = local_2ac8._8_8_;
        local_1728._8_4_ = local_2ac8._8_4_;
        fStack_171c = local_2ac8._12_4_;
        local_16a8._0_4_ = local_2ac8._0_4_;
        fVar146 = (float)local_16a8;
        local_16a8._4_4_ = local_2ac8._4_4_;
        fVar147 = local_16a8._4_4_;
        _local_1728 = auVar7;
        local_16a8 = uVar8;
        switch(in_stack_00000038) {
        case 1:
          local_19f8._8_8_ = SUB168(ZEXT816(0),4);
          local_18e8 = local_2ac8._0_8_;
          uStack_18e0 = local_2ac8._8_8_;
          local_18f8 = 0;
          uStack_18f0 = local_19f8._8_8_;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = local_19f8._8_8_;
          _local_1a08 = vmaxps_avx(local_2ac8,auVar96 << 0x40);
          local_19f8 = ZEXT816(0) << 0x20;
          break;
        case 2:
          local_1920 = in_stack_00000040;
          local_1928 = 0;
          local_188c = *(float *)*in_stack_00000040;
          local_1888 = local_2ac8._0_8_;
          uStack_1880 = local_2ac8._8_8_;
          local_1878._0_12_ = ZEXT812(0);
          local_1878._12_4_ = 0;
          local_1808 = 0;
          uStack_1800 = 0;
          local_1818 = local_2ac8._0_8_;
          uStack_1810 = local_2ac8._8_8_;
          local_18a8 = vmaxps_avx(ZEXT816(0),local_2ac8);
          local_17e8 = 0;
          uStack_17e0 = 0;
          local_17f8 = local_2ac8._0_8_;
          uStack_17f0 = local_2ac8._8_8_;
          local_18b8 = vminps_avx(ZEXT816(0),local_2ac8);
          local_1828._4_4_ = local_188c;
          local_1828._0_4_ = local_188c;
          local_1828._8_4_ = local_188c;
          local_1828._12_4_ = local_188c;
          local_1838 = local_18b8._0_8_;
          uVar8 = local_1838;
          uStack_1830 = local_18b8._8_8_;
          uVar9 = uStack_1830;
          local_1838._0_4_ = local_18b8._0_4_;
          local_1838._4_4_ = local_18b8._4_4_;
          uStack_1830._0_4_ = local_18b8._8_4_;
          uStack_1830._4_4_ = local_18b8._12_4_;
          local_15c8 = local_188c * (float)local_1838;
          fStack_15c4 = local_188c * local_1838._4_4_;
          fStack_15c0 = local_188c * (float)uStack_1830;
          fStack_15bc = local_188c * uStack_1830._4_4_;
          local_15b8._0_4_ = local_18a8._0_4_;
          local_15b8._4_4_ = local_18a8._4_4_;
          fStack_15b0 = local_18a8._8_4_;
          fStack_15ac = local_18a8._12_4_;
          local_1a08._4_4_ = (float)local_15b8._4_4_ + fStack_15c4;
          local_1a08._0_4_ = (float)local_15b8._0_4_ + local_15c8;
          uStack_1a00._0_4_ = fStack_15b0 + fStack_15c0;
          uStack_1a00._4_4_ = fStack_15ac + fStack_15bc;
          local_1868 = local_1878;
          local_1858 = local_188c;
          fStack_1854 = local_188c;
          fStack_1850 = local_188c;
          fStack_184c = local_188c;
          local_183c = local_188c;
          local_1838 = uVar8;
          uStack_1830 = uVar9;
          _local_15b8 = local_18a8;
          break;
        case 3:
          local_1930 = in_stack_00000040;
          local_1938 = 0;
          local_1988 = *(undefined4 *)*in_stack_00000040;
          local_1a38 = CONCAT44(local_1988,local_1988);
          uStack_1a30 = CONCAT44(local_1988,local_1988);
          local_1940 = in_stack_00000040;
          local_1948 = 1;
          local_19a8 = *(undefined4 *)(*in_stack_00000040 + 4);
          local_1a48 = CONCAT44(local_19a8,local_19a8);
          uStack_1a40 = CONCAT44(local_19a8,local_19a8);
          local_18c8 = local_2ac8._0_8_;
          uStack_18c0 = local_2ac8._8_8_;
          auVar10._8_8_ = uStack_1a30;
          auVar10._0_8_ = local_1a38;
          local_17c8 = vmaxps_avx(local_2ac8,auVar10);
          auVar11._8_8_ = uStack_1a40;
          auVar11._0_8_ = local_1a48;
          _local_1a08 = vminps_avx(local_17c8,auVar11);
          uStack_19a4 = local_19a8;
          uStack_19a0 = local_19a8;
          uStack_199c = local_19a8;
          local_198c = local_19a8;
          uStack_1984 = local_1988;
          uStack_1980 = local_1988;
          uStack_197c = local_1988;
          local_196c = local_1988;
          local_18d8 = local_1a38;
          uStack_18d0 = uStack_1a30;
          local_17d8 = local_1a48;
          uStack_17d0 = uStack_1a40;
          break;
        case 4:
          local_17a8 = local_2ac8._0_8_;
          uStack_17a0 = local_2ac8._8_8_;
          local_176c = 0x3f800000;
          local_1788 = 0x3f800000;
          uStack_1784 = 0x3f800000;
          uStack_1780 = 0x3f800000;
          uStack_177c = 0x3f800000;
          local_17b8 = 0x3f8000003f800000;
          uStack_17b0 = 0x3f8000003f800000;
          local_15d8._8_8_ = 0x3f8000003f800000;
          local_15d8._0_8_ = 0x3f8000003f800000;
          local_11a8 = ZEXT816(0) << 0x20;
          local_1798._8_8_ = SUB168(ZEXT816(0),4);
          local_e78 = 0;
          uStack_e70 = local_1798._8_8_;
          local_e88 = local_2ac8._0_8_;
          uStack_e80 = local_2ac8._8_8_;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = local_1798._8_8_;
          auVar7 = vsubps_avx(auVar97 << 0x40,local_2ac8);
          local_11f8 = 0x3f8000003f800000;
          uStack_11f0 = 0x3f8000003f800000;
          local_11b8._0_8_ = auVar7._0_8_;
          local_11b8._8_8_ = auVar7._8_8_;
          local_f18 = local_11b8._0_8_;
          uStack_f10 = local_11b8._8_8_;
          local_f28 = 0x42b0c0a542b0c0a5;
          uStack_f20 = 0x42b0c0a542b0c0a5;
          auVar32._8_8_ = 0x42b0c0a542b0c0a5;
          auVar32._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar32);
          local_11b8._0_8_ = auVar7._0_8_;
          local_11b8._8_8_ = auVar7._8_8_;
          local_f38 = local_11b8._0_8_;
          uStack_f30 = local_11b8._8_8_;
          local_f48 = 0xc2b0c0a5c2b0c0a5;
          uStack_f40 = 0xc2b0c0a5c2b0c0a5;
          auVar31._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar31);
          local_11b8._0_8_ = auVar6._0_8_;
          local_11b8._8_8_ = auVar6._8_8_;
          local_10b8 = local_11b8._0_8_;
          uVar116 = local_10b8;
          uStack_10b0 = local_11b8._8_8_;
          uVar117 = uStack_10b0;
          local_10c8 = 0x3fb8aa3b3fb8aa3b;
          uStack_10c0 = 0x3fb8aa3b3fb8aa3b;
          local_10b8._0_4_ = auVar6._0_4_;
          local_10b8._4_4_ = auVar6._4_4_;
          uStack_10b0._0_4_ = auVar6._8_4_;
          uStack_10b0._4_4_ = auVar6._12_4_;
          local_11d8._4_4_ = local_10b8._4_4_ * 1.442695;
          local_11d8._0_4_ = (float)local_10b8 * 1.442695;
          uStack_11d0._0_4_ = (float)uStack_10b0 * 1.442695;
          uStack_11d0._4_4_ = uStack_10b0._4_4_ * 1.442695;
          local_ed8 = local_11d8;
          uStack_ed0 = uStack_11d0;
          local_ee8 = 0x3f0000003f000000;
          uStack_ee0 = 0x3f0000003f000000;
          local_11d8._0_4_ = (float)local_10b8 * 1.442695 + 0.5;
          local_11d8._4_4_ = local_10b8._4_4_ * 1.442695 + 0.5;
          fVar146 = (float)uStack_10b0 * 1.442695 + 0.5;
          fVar147 = uStack_10b0._4_4_ * 1.442695 + 0.5;
          uStack_11d0._0_4_ = fVar146;
          uStack_11d0._4_4_ = fVar147;
          local_e58 = local_11d8;
          uStack_e50 = uStack_11d0;
          local_11e8._4_4_ = (int)(float)local_11d8._4_4_;
          local_11e8._0_4_ = (int)(float)local_11d8._0_4_;
          local_11e8._8_4_ = (int)fVar146;
          local_11e8._12_4_ = (int)fVar147;
          local_e28 = local_11e8._0_8_;
          uStack_e20 = local_11e8._8_8_;
          auVar33._8_8_ = local_11e8._8_8_;
          auVar33._0_8_ = local_11e8._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar33);
          local_11c8 = auVar5._0_8_;
          uStack_11c0 = auVar5._8_8_;
          local_df8 = local_11c8;
          uStack_df0 = uStack_11c0;
          local_e08 = local_11d8;
          uStack_e00 = uStack_11d0;
          auVar35._8_8_ = uStack_11d0;
          auVar35._0_8_ = local_11d8;
          auVar7 = vcmpps_avx(auVar35,auVar5,1);
          local_1208._0_8_ = auVar7._0_8_;
          local_1208._8_8_ = auVar7._8_8_;
          local_db8 = local_1208._0_8_;
          uStack_db0 = local_1208._8_8_;
          local_dc8 = 0x3f8000003f800000;
          uStack_dc0 = 0x3f8000003f800000;
          auVar37._8_8_ = 0x3f8000003f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          local_1208 = vpand_avx(auVar7,auVar37);
          local_eb8 = local_11c8;
          uStack_eb0 = uStack_11c0;
          local_ec8 = local_1208._0_8_;
          uStack_ec0 = local_1208._8_8_;
          _local_11d8 = vsubps_avx(auVar5,local_1208);
          local_d78 = local_11d8;
          local_d68 = ::_ps_cephes_exp_C1;
          local_1198 = local_11b8;
          local_c88 = local_11d8;
          uStack_c80 = uStack_11d0;
          local_c98[0] = 0.6933594;
          local_c98[1] = 0.6933594;
          afStack_c90[0] = 0.6933594;
          afStack_c90[1] = 0.6933594;
          local_ca8 = local_11b8._0_8_;
          uStack_ca0 = local_11b8._8_8_;
          auVar41._8_4_ = 0.6933594;
          auVar41._12_4_ = 0.6933594;
          auVar41._0_4_ = 0.6933594;
          auVar41._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar41,_local_11d8,auVar6);
          local_d80 = ::_ps_cephes_exp_C2;
          local_c58 = local_11d8;
          uStack_c50 = uStack_11d0;
          local_c68[0] = -0.00021219444;
          local_c68[1] = -0.00021219444;
          afStack_c60[0] = -0.00021219444;
          afStack_c60[1] = -0.00021219444;
          local_11b8._0_8_ = auVar7._0_8_;
          local_c78 = local_11b8._0_8_;
          local_11b8._8_8_ = auVar7._8_8_;
          uStack_c70 = local_11b8._8_8_;
          auVar42._8_4_ = -0.00021219444;
          auVar42._12_4_ = -0.00021219444;
          auVar42._0_4_ = -0.00021219444;
          auVar42._4_4_ = -0.00021219444;
          local_11b8 = vfnmadd213ps_fma(auVar42,_local_11d8,auVar7);
          local_10d8 = local_11b8._0_8_;
          uVar114 = local_10d8;
          uStack_10d0 = local_11b8._8_8_;
          uVar115 = uStack_10d0;
          local_10e8 = local_11b8._0_8_;
          uStack_10e0 = local_11b8._8_8_;
          local_10d8._0_4_ = local_11b8._0_4_;
          local_10d8._4_4_ = local_11b8._4_4_;
          uStack_10d0._0_4_ = local_11b8._8_4_;
          uStack_10d0._4_4_ = local_11b8._12_4_;
          local_11c8._4_4_ = local_10d8._4_4_ * local_10d8._4_4_;
          local_11c8._0_4_ = (float)local_10d8 * (float)local_10d8;
          uStack_11c0._0_4_ = (float)uStack_10d0 * (float)uStack_10d0;
          uStack_11c0._4_4_ = uStack_10d0._4_4_ * uStack_10d0._4_4_;
          uStack_1210 = 0x3950696739506967;
          local_1218 = (undefined1  [8])0x3950696739506967;
          local_1188 = local_1218;
          local_1120 = ::_ps_cephes_exp_p1;
          local_1088 = 0x3950696739506967;
          uStack_1080 = 0x3950696739506967;
          local_1098 = local_11b8._0_8_;
          uStack_1090 = local_11b8._8_8_;
          local_10a8[0] = 0.0013981999;
          local_10a8[1] = 0.0013981999;
          afStack_10a0[0] = 0.0013981999;
          afStack_10a0[1] = 0.0013981999;
          auVar24._8_4_ = 0.0013981999;
          auVar24._12_4_ = 0.0013981999;
          auVar24._0_4_ = 0.0013981999;
          auVar24._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_11b8,_local_1218,auVar24);
          local_1138 = ::_ps_cephes_exp_p2;
          local_1218 = auVar7._0_8_;
          local_1058 = local_1218;
          uStack_1210 = auVar7._8_8_;
          uStack_1050 = uStack_1210;
          local_1068 = local_11b8._0_8_;
          uStack_1060 = local_11b8._8_8_;
          local_1078[0] = 0.008333452;
          local_1078[1] = 0.008333452;
          afStack_1070[0] = 0.008333452;
          afStack_1070[1] = 0.008333452;
          auVar25._8_4_ = 0.008333452;
          auVar25._12_4_ = 0.008333452;
          auVar25._0_4_ = 0.008333452;
          auVar25._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_11b8,auVar7,auVar25);
          local_1150 = ::_ps_cephes_exp_p3;
          local_1218 = auVar7._0_8_;
          local_1028 = local_1218;
          uStack_1210 = auVar7._8_8_;
          uStack_1020 = uStack_1210;
          local_1038 = local_11b8._0_8_;
          uStack_1030 = local_11b8._8_8_;
          local_1048[0] = 0.041665796;
          local_1048[1] = 0.041665796;
          afStack_1040[0] = 0.041665796;
          afStack_1040[1] = 0.041665796;
          auVar26._8_4_ = 0.041665796;
          auVar26._12_4_ = 0.041665796;
          auVar26._0_4_ = 0.041665796;
          auVar26._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_11b8,auVar7,auVar26);
          local_1168 = ::_ps_cephes_exp_p4;
          local_1218 = auVar7._0_8_;
          local_ff8 = local_1218;
          uStack_1210 = auVar7._8_8_;
          uStack_ff0 = uStack_1210;
          local_1008 = local_11b8._0_8_;
          uStack_1000 = local_11b8._8_8_;
          local_1018[0] = 0.16666666;
          local_1018[1] = 0.16666666;
          afStack_1010[0] = 0.16666666;
          afStack_1010[1] = 0.16666666;
          auVar27._8_4_ = 0.16666666;
          auVar27._12_4_ = 0.16666666;
          auVar27._0_4_ = 0.16666666;
          auVar27._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_11b8,auVar7,auVar27);
          local_1180 = ::_ps_cephes_exp_p5;
          local_1218 = auVar7._0_8_;
          local_fc8 = local_1218;
          uStack_1210 = auVar7._8_8_;
          uStack_fc0 = uStack_1210;
          local_fd8 = local_11b8._0_8_;
          uStack_fd0 = local_11b8._8_8_;
          local_fe8[0] = 0.5;
          local_fe8[1] = 0.5;
          afStack_fe0[0] = 0.5;
          afStack_fe0[1] = 0.5;
          auVar28._8_4_ = 0.5;
          auVar28._12_4_ = 0.5;
          auVar28._0_4_ = 0.5;
          auVar28._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_11b8,auVar7,auVar28);
          local_1190 = local_11c8;
          local_1218 = auVar7._0_8_;
          local_f98 = local_1218;
          uStack_1210 = auVar7._8_8_;
          uStack_f90 = uStack_1210;
          local_fa8 = local_11c8;
          uStack_fa0 = uStack_11c0;
          local_fb8 = local_11b8._0_8_;
          uStack_fb0 = local_11b8._8_8_;
          auVar7 = vfmadd213ps_fma(_local_11c8,auVar7,local_11b8);
          local_1218 = auVar7._0_8_;
          uStack_1210 = auVar7._8_8_;
          local_ef8 = local_1218;
          uVar118 = local_ef8;
          uStack_ef0 = uStack_1210;
          uVar119 = uStack_ef0;
          local_f08 = 0x3f8000003f800000;
          uStack_f00 = 0x3f8000003f800000;
          local_ef8._0_4_ = auVar7._0_4_;
          local_ef8._4_4_ = auVar7._4_4_;
          uStack_ef0._0_4_ = auVar7._8_4_;
          uStack_ef0._4_4_ = auVar7._12_4_;
          local_1218._4_4_ = local_ef8._4_4_ + 1.0;
          local_1218._0_4_ = (float)local_ef8 + 1.0;
          uStack_1210._0_4_ = (float)uStack_ef0 + 1.0;
          uStack_1210._4_4_ = uStack_ef0._4_4_ + 1.0;
          local_e68 = local_11d8;
          uVar120 = local_e68;
          uStack_e60 = uStack_11d0;
          uVar121 = uStack_e60;
          local_e68._0_4_ = local_11d8._0_4_;
          local_e68._4_4_ = local_11d8._4_4_;
          uStack_e60._0_4_ = local_11d8._8_4_;
          uStack_e60._4_4_ = local_11d8._12_4_;
          local_11e8._4_4_ = (int)local_e68._4_4_;
          local_11e8._0_4_ = (int)(float)local_e68;
          local_11e8._8_4_ = (int)(float)uStack_e60;
          local_11e8._12_4_ = (int)uStack_e60._4_4_;
          local_f78 = local_11e8._0_8_;
          uStack_f70 = local_11e8._8_8_;
          local_f88 = 0x7f0000007f;
          uStack_f80 = 0x7f0000007f;
          auVar30._8_8_ = local_11e8._8_8_;
          auVar30._0_8_ = local_11e8._0_8_;
          auVar29._8_8_ = 0x7f0000007f;
          auVar29._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar30,auVar29);
          local_11e8._0_8_ = auVar7._0_8_;
          local_11e8._8_8_ = auVar7._8_8_;
          local_f58 = local_11e8._0_8_;
          uStack_f50 = local_11e8._8_8_;
          local_f5c = 0x17;
          local_11e8 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_d28 = local_11e8._0_8_;
          uStack_d20 = local_11e8._8_8_;
          local_1228 = local_11e8._0_8_;
          uStack_1220 = local_11e8._8_8_;
          local_10f8 = local_1218;
          uStack_10f0 = uStack_1210;
          local_1108 = local_11e8._0_8_;
          uVar8 = local_1108;
          uStack_1100 = local_11e8._8_8_;
          uVar9 = uStack_1100;
          local_1108._0_4_ = local_11e8._0_4_;
          local_1108._4_4_ = local_11e8._4_4_;
          uStack_1100._0_4_ = local_11e8._8_4_;
          uStack_1100._4_4_ = local_11e8._12_4_;
          local_1218._0_4_ = ((float)local_ef8 + 1.0) * (float)local_1108;
          local_1218._4_4_ = (local_ef8._4_4_ + 1.0) * local_1108._4_4_;
          uStack_1100._0_4_ = ((float)uStack_ef0 + 1.0) * (float)uStack_1100;
          uStack_1100._4_4_ = (uStack_ef0._4_4_ + 1.0) * uStack_1100._4_4_;
          uStack_1210._0_4_ = (float)uStack_1100;
          uStack_1210._4_4_ = uStack_1100._4_4_;
          local_15e8 = local_1218;
          uStack_15e0 = uStack_1210;
          local_15a8 = (float)local_1218._0_4_ + 1.0;
          fStack_15a4 = (float)local_1218._4_4_ + 1.0;
          fStack_15a0 = (float)uStack_1100 + 1.0;
          fStack_159c = uStack_1100._4_4_ + 1.0;
          auVar14._4_4_ = fStack_15a4;
          auVar14._0_4_ = local_15a8;
          auVar14._8_4_ = fStack_15a0;
          auVar14._12_4_ = fStack_159c;
          _local_1a08 = vdivps_avx(local_15d8,auVar14);
          local_1798 = local_11a8;
          local_1598 = local_15d8;
          local_1178 = local_1198;
          local_1170 = local_1188;
          local_1160 = local_1198;
          local_1158 = local_1188;
          local_1148 = local_1198;
          local_1140 = local_1188;
          local_1130 = local_1198;
          local_1128 = local_1188;
          local_1118 = local_1198;
          local_1110 = local_1188;
          local_1108 = uVar8;
          uStack_1100 = uVar9;
          local_10d8 = uVar114;
          uStack_10d0 = uVar115;
          local_10b8 = uVar116;
          uStack_10b0 = uVar117;
          local_ef8 = uVar118;
          uStack_ef0 = uVar119;
          local_e68 = uVar120;
          uStack_e60 = uVar121;
          local_d88 = local_1198;
          local_d70 = local_1198;
          local_d60 = local_d78;
          break;
        case 5:
          local_1768 = local_2ac8._0_8_;
          uStack_1760 = local_2ac8._8_8_;
          local_1508 = 0;
          uStack_1500 = 0;
          local_1558 = 0x3f8000003f800000;
          uStack_1550 = 0x3f8000003f800000;
          local_1278 = local_2ac8._0_8_;
          uStack_1270 = local_2ac8._8_8_;
          local_1288 = 0x42b0c0a542b0c0a5;
          uStack_1280 = 0x42b0c0a542b0c0a5;
          auVar23._8_8_ = 0x42b0c0a542b0c0a5;
          auVar23._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(local_2ac8,auVar23);
          local_1518._0_8_ = auVar7._0_8_;
          local_1518._8_8_ = auVar7._8_8_;
          local_1298 = local_1518._0_8_;
          uStack_1290 = local_1518._8_8_;
          local_12a8 = 0xc2b0c0a5c2b0c0a5;
          uStack_12a0 = 0xc2b0c0a5c2b0c0a5;
          auVar22._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar22);
          local_1518._0_8_ = auVar6._0_8_;
          local_1518._8_8_ = auVar6._8_8_;
          local_1418 = local_1518._0_8_;
          uVar116 = local_1418;
          uStack_1410 = local_1518._8_8_;
          uVar117 = uStack_1410;
          local_1428 = 0x3fb8aa3b3fb8aa3b;
          uStack_1420 = 0x3fb8aa3b3fb8aa3b;
          local_1418._0_4_ = auVar6._0_4_;
          local_1418._4_4_ = auVar6._4_4_;
          uStack_1410._0_4_ = auVar6._8_4_;
          uStack_1410._4_4_ = auVar6._12_4_;
          local_1538._4_4_ = local_1418._4_4_ * 1.442695;
          local_1538._0_4_ = (float)local_1418 * 1.442695;
          uStack_1530._0_4_ = (float)uStack_1410 * 1.442695;
          uStack_1530._4_4_ = uStack_1410._4_4_ * 1.442695;
          local_1238 = local_1538;
          uStack_1230 = uStack_1530;
          local_1248 = 0x3f0000003f000000;
          uStack_1240 = 0x3f0000003f000000;
          local_1538._0_4_ = (float)local_1418 * 1.442695 + 0.5;
          local_1538._4_4_ = local_1418._4_4_ * 1.442695 + 0.5;
          fVar146 = (float)uStack_1410 * 1.442695 + 0.5;
          fVar147 = uStack_1410._4_4_ * 1.442695 + 0.5;
          uStack_1530._0_4_ = fVar146;
          uStack_1530._4_4_ = fVar147;
          local_e38 = local_1538;
          uStack_e30 = uStack_1530;
          local_1548._4_4_ = (int)(float)local_1538._4_4_;
          local_1548._0_4_ = (int)(float)local_1538._0_4_;
          local_1548._8_4_ = (int)fVar146;
          local_1548._12_4_ = (int)fVar147;
          local_e18 = local_1548._0_8_;
          uStack_e10 = local_1548._8_8_;
          auVar34._8_8_ = local_1548._8_8_;
          auVar34._0_8_ = local_1548._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar34);
          local_1528 = auVar5._0_8_;
          uStack_1520 = auVar5._8_8_;
          local_dd8 = local_1528;
          uStack_dd0 = uStack_1520;
          local_de8 = local_1538;
          uStack_de0 = uStack_1530;
          auVar36._8_8_ = uStack_1530;
          auVar36._0_8_ = local_1538;
          auVar7 = vcmpps_avx(auVar36,auVar5,1);
          local_1568._0_8_ = auVar7._0_8_;
          local_1568._8_8_ = auVar7._8_8_;
          local_d98 = local_1568._0_8_;
          uStack_d90 = local_1568._8_8_;
          local_da8 = 0x3f8000003f800000;
          uStack_da0 = 0x3f8000003f800000;
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          local_1568 = vpand_avx(auVar7,auVar38);
          local_e98 = local_1528;
          uStack_e90 = uStack_1520;
          local_ea8 = local_1568._0_8_;
          uStack_ea0 = local_1568._8_8_;
          _local_1538 = vsubps_avx(auVar5,local_1568);
          local_d48 = local_1538;
          local_d38 = ::_ps_cephes_exp_C1;
          local_14f8 = local_1518;
          local_ce8 = local_1538;
          uStack_ce0 = uStack_1530;
          local_cf8[0] = 0.6933594;
          local_cf8[1] = 0.6933594;
          afStack_cf0[0] = 0.6933594;
          afStack_cf0[1] = 0.6933594;
          local_d08 = local_1518._0_8_;
          uStack_d00 = local_1518._8_8_;
          auVar39._8_4_ = 0.6933594;
          auVar39._12_4_ = 0.6933594;
          auVar39._0_4_ = 0.6933594;
          auVar39._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar39,_local_1538,auVar6);
          local_d50 = ::_ps_cephes_exp_C2;
          local_cb8 = local_1538;
          uStack_cb0 = uStack_1530;
          local_cc8[0] = -0.00021219444;
          local_cc8[1] = -0.00021219444;
          afStack_cc0[0] = -0.00021219444;
          afStack_cc0[1] = -0.00021219444;
          local_1518._0_8_ = auVar7._0_8_;
          local_cd8 = local_1518._0_8_;
          local_1518._8_8_ = auVar7._8_8_;
          uStack_cd0 = local_1518._8_8_;
          auVar40._8_4_ = -0.00021219444;
          auVar40._12_4_ = -0.00021219444;
          auVar40._0_4_ = -0.00021219444;
          auVar40._4_4_ = -0.00021219444;
          local_1518 = vfnmadd213ps_fma(auVar40,_local_1538,auVar7);
          local_1438 = local_1518._0_8_;
          uVar114 = local_1438;
          uStack_1430 = local_1518._8_8_;
          uVar115 = uStack_1430;
          local_1448 = local_1518._0_8_;
          uStack_1440 = local_1518._8_8_;
          local_1438._0_4_ = local_1518._0_4_;
          local_1438._4_4_ = local_1518._4_4_;
          uStack_1430._0_4_ = local_1518._8_4_;
          uStack_1430._4_4_ = local_1518._12_4_;
          local_1528._4_4_ = local_1438._4_4_ * local_1438._4_4_;
          local_1528._0_4_ = (float)local_1438 * (float)local_1438;
          uStack_1520._0_4_ = (float)uStack_1430 * (float)uStack_1430;
          uStack_1520._4_4_ = uStack_1430._4_4_ * uStack_1430._4_4_;
          uStack_1570 = 0x3950696739506967;
          local_1578 = (undefined1  [8])0x3950696739506967;
          local_14e8 = local_1578;
          local_1480 = ::_ps_cephes_exp_p1;
          local_13e8 = 0x3950696739506967;
          uStack_13e0 = 0x3950696739506967;
          local_13f8 = local_1518._0_8_;
          uStack_13f0 = local_1518._8_8_;
          local_1408[0] = 0.0013981999;
          local_1408[1] = 0.0013981999;
          afStack_1400[0] = 0.0013981999;
          afStack_1400[1] = 0.0013981999;
          auVar15._8_4_ = 0.0013981999;
          auVar15._12_4_ = 0.0013981999;
          auVar15._0_4_ = 0.0013981999;
          auVar15._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_1518,_local_1578,auVar15);
          local_1498 = ::_ps_cephes_exp_p2;
          local_1578 = auVar7._0_8_;
          local_13b8 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_13b0 = uStack_1570;
          local_13c8 = local_1518._0_8_;
          uStack_13c0 = local_1518._8_8_;
          local_13d8[0] = 0.008333452;
          local_13d8[1] = 0.008333452;
          afStack_13d0[0] = 0.008333452;
          afStack_13d0[1] = 0.008333452;
          auVar16._8_4_ = 0.008333452;
          auVar16._12_4_ = 0.008333452;
          auVar16._0_4_ = 0.008333452;
          auVar16._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar16);
          local_14b0 = ::_ps_cephes_exp_p3;
          local_1578 = auVar7._0_8_;
          local_1388 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1380 = uStack_1570;
          local_1398 = local_1518._0_8_;
          uStack_1390 = local_1518._8_8_;
          local_13a8[0] = 0.041665796;
          local_13a8[1] = 0.041665796;
          afStack_13a0[0] = 0.041665796;
          afStack_13a0[1] = 0.041665796;
          auVar17._8_4_ = 0.041665796;
          auVar17._12_4_ = 0.041665796;
          auVar17._0_4_ = 0.041665796;
          auVar17._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar17);
          local_14c8 = ::_ps_cephes_exp_p4;
          local_1578 = auVar7._0_8_;
          local_1358 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1350 = uStack_1570;
          local_1368 = local_1518._0_8_;
          uStack_1360 = local_1518._8_8_;
          local_1378[0] = 0.16666666;
          local_1378[1] = 0.16666666;
          afStack_1370[0] = 0.16666666;
          afStack_1370[1] = 0.16666666;
          auVar18._8_4_ = 0.16666666;
          auVar18._12_4_ = 0.16666666;
          auVar18._0_4_ = 0.16666666;
          auVar18._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar18);
          local_14e0 = ::_ps_cephes_exp_p5;
          local_1578 = auVar7._0_8_;
          local_1328 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1320 = uStack_1570;
          local_1338 = local_1518._0_8_;
          uStack_1330 = local_1518._8_8_;
          local_1348[0] = 0.5;
          local_1348[1] = 0.5;
          afStack_1340[0] = 0.5;
          afStack_1340[1] = 0.5;
          auVar19._8_4_ = 0.5;
          auVar19._12_4_ = 0.5;
          auVar19._0_4_ = 0.5;
          auVar19._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar19);
          local_14f0 = local_1528;
          local_1578 = auVar7._0_8_;
          local_12f8 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_12f0 = uStack_1570;
          local_1308 = local_1528;
          uStack_1300 = uStack_1520;
          local_1318 = local_1518._0_8_;
          uStack_1310 = local_1518._8_8_;
          auVar7 = vfmadd213ps_fma(_local_1528,auVar7,local_1518);
          local_1578 = auVar7._0_8_;
          uStack_1570 = auVar7._8_8_;
          local_1258 = local_1578;
          uVar118 = local_1258;
          uStack_1250 = uStack_1570;
          uVar119 = uStack_1250;
          local_1268 = 0x3f8000003f800000;
          uStack_1260 = 0x3f8000003f800000;
          local_1258._0_4_ = auVar7._0_4_;
          local_1258._4_4_ = auVar7._4_4_;
          uStack_1250._0_4_ = auVar7._8_4_;
          uStack_1250._4_4_ = auVar7._12_4_;
          local_1578._4_4_ = local_1258._4_4_ + 1.0;
          local_1578._0_4_ = (float)local_1258 + 1.0;
          uStack_1570._0_4_ = (float)uStack_1250 + 1.0;
          uStack_1570._4_4_ = uStack_1250._4_4_ + 1.0;
          local_e48 = local_1538;
          uVar120 = local_e48;
          uStack_e40 = uStack_1530;
          uVar121 = uStack_e40;
          local_e48._0_4_ = local_1538._0_4_;
          local_e48._4_4_ = local_1538._4_4_;
          uStack_e40._0_4_ = local_1538._8_4_;
          uStack_e40._4_4_ = local_1538._12_4_;
          local_1548._4_4_ = (int)local_e48._4_4_;
          local_1548._0_4_ = (int)(float)local_e48;
          local_1548._8_4_ = (int)(float)uStack_e40;
          local_1548._12_4_ = (int)uStack_e40._4_4_;
          local_12d8 = local_1548._0_8_;
          uStack_12d0 = local_1548._8_8_;
          local_12e8 = 0x7f0000007f;
          uStack_12e0 = 0x7f0000007f;
          auVar21._8_8_ = local_1548._8_8_;
          auVar21._0_8_ = local_1548._0_8_;
          auVar20._8_8_ = 0x7f0000007f;
          auVar20._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar21,auVar20);
          local_1548._0_8_ = auVar7._0_8_;
          local_1548._8_8_ = auVar7._8_8_;
          local_12b8 = local_1548._0_8_;
          uStack_12b0 = local_1548._8_8_;
          local_12bc = 0x17;
          local_1548 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_d18 = local_1548._0_8_;
          uStack_d10 = local_1548._8_8_;
          local_1588 = local_1548._0_8_;
          uStack_1580 = local_1548._8_8_;
          local_1458 = local_1578;
          uStack_1450 = uStack_1570;
          local_1468 = local_1548._0_8_;
          uVar8 = local_1468;
          uStack_1460 = local_1548._8_8_;
          uVar9 = uStack_1460;
          local_1468._0_4_ = local_1548._0_4_;
          local_1468._4_4_ = local_1548._4_4_;
          uStack_1460._0_4_ = local_1548._8_4_;
          uStack_1460._4_4_ = local_1548._12_4_;
          local_1578._0_4_ = ((float)local_1258 + 1.0) * (float)local_1468;
          local_1578._4_4_ = (local_1258._4_4_ + 1.0) * local_1468._4_4_;
          uStack_1460._0_4_ = ((float)uStack_1250 + 1.0) * (float)uStack_1460;
          uStack_1460._4_4_ = (uStack_1250._4_4_ + 1.0) * uStack_1460._4_4_;
          uStack_1570._0_4_ = (float)uStack_1460;
          uStack_1570._4_4_ = uStack_1460._4_4_;
          local_173c = 0x3f800000;
          local_1758 = 0x3f800000;
          uStack_1754 = 0x3f800000;
          uStack_1750 = 0x3f800000;
          uStack_174c = 0x3f800000;
          local_1608 = 0x3f8000003f800000;
          uStack_1600 = 0x3f8000003f800000;
          local_15f8 = local_1578;
          uStack_15f0 = uStack_1570;
          local_5b8._4_4_ = (float)local_1578._4_4_ + 1.0;
          local_5b8._0_4_ = (float)local_1578._0_4_ + 1.0;
          uStack_5b0._0_4_ = (float)uStack_1460 + 1.0;
          uStack_5b0._4_4_ = uStack_1460._4_4_ + 1.0;
          local_5d8 = 0x3f8000003f800000;
          uStack_5d0 = 0x3f8000003f800000;
          local_5a8 = 0;
          uStack_5a0 = 0;
          local_98 = local_5b8;
          uStack_90 = uStack_5b0;
          local_a8 = 0;
          uStack_a0 = 0;
          auVar79._8_8_ = uStack_5b0;
          auVar79._0_8_ = local_5b8;
          local_5e8 = vcmpps_avx(auVar79,ZEXT816(0),2);
          local_218 = local_5b8;
          uStack_210 = uStack_5b0;
          local_228 = 0x80000000800000;
          uStack_220 = 0x80000000800000;
          auVar73._8_8_ = uStack_5b0;
          auVar73._0_8_ = local_5b8;
          auVar72._8_8_ = 0x80000000800000;
          auVar72._0_8_ = 0x80000000800000;
          auVar7 = vmaxps_avx(auVar73,auVar72);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_88 = local_5b8;
          uStack_80 = uStack_5b0;
          local_258 = local_5b8;
          uStack_250 = uStack_5b0;
          local_25c = 0x17;
          auVar6 = vpsrld_avx(auVar7,ZEXT416(0x17));
          local_108 = local_5b8;
          uStack_100 = uStack_5b0;
          local_118 = 0x807fffff807fffff;
          uStack_110 = 0x807fffff807fffff;
          auVar77._8_8_ = 0x807fffff807fffff;
          auVar77._0_8_ = 0x807fffff807fffff;
          auVar7 = vpand_avx(auVar7,auVar77);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_48 = local_5b8;
          uStack_40 = uStack_5b0;
          local_58 = 0x3f0000003f000000;
          uStack_50 = 0x3f0000003f000000;
          auVar80._8_8_ = 0x3f0000003f000000;
          auVar80._0_8_ = 0x3f0000003f000000;
          auVar5 = vpor_avx(auVar7,auVar80);
          local_5c8._0_8_ = auVar6._0_8_;
          local_5c8._8_8_ = auVar6._8_8_;
          local_238 = local_5c8._0_8_;
          uStack_230 = local_5c8._8_8_;
          local_248 = 0x7f0000007f;
          uStack_240 = 0x7f0000007f;
          auVar71._8_8_ = 0x7f0000007f;
          auVar71._0_8_ = 0x7f0000007f;
          local_5c8 = vpsubd_avx(auVar6,auVar71);
          local_168 = local_5c8._0_8_;
          uStack_160 = local_5c8._8_8_;
          auVar7 = vcvtdq2ps_avx(local_5c8);
          local_5f8 = auVar7._0_8_;
          uStack_5f0 = auVar7._8_8_;
          local_1b8 = local_5f8;
          uVar142 = local_1b8;
          uStack_1b0 = uStack_5f0;
          uVar143 = uStack_1b0;
          local_1c8 = 0x3f8000003f800000;
          uStack_1c0 = 0x3f8000003f800000;
          local_1b8._0_4_ = auVar7._0_4_;
          local_1b8._4_4_ = auVar7._4_4_;
          uStack_1b0._0_4_ = auVar7._8_4_;
          uStack_1b0._4_4_ = auVar7._12_4_;
          local_5f8._4_4_ = local_1b8._4_4_ + 1.0;
          local_5f8._0_4_ = (float)local_1b8 + 1.0;
          uStack_5f0._0_4_ = (float)uStack_1b0 + 1.0;
          uStack_5f0._4_4_ = uStack_1b0._4_4_ + 1.0;
          local_5b8 = auVar5._0_8_;
          uStack_5b0 = auVar5._8_8_;
          local_28 = local_5b8;
          uStack_20 = uStack_5b0;
          local_38 = 0x3f3504f33f3504f3;
          uStack_30 = 0x3f3504f33f3504f3;
          auVar81._8_8_ = 0x3f3504f33f3504f3;
          auVar81._0_8_ = 0x3f3504f33f3504f3;
          local_608 = vcmpps_avx(auVar5,auVar81,1);
          local_128 = local_5b8;
          uStack_120 = uStack_5b0;
          local_138 = local_608._0_8_;
          uStack_130 = local_608._8_8_;
          local_618 = vpand_avx(auVar5,local_608);
          local_178 = local_5b8;
          uStack_170 = uStack_5b0;
          local_188 = 0x3f8000003f800000;
          uStack_180 = 0x3f8000003f800000;
          auVar75._8_8_ = 0x3f8000003f800000;
          auVar75._0_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar5,auVar75);
          local_148 = 0x3f8000003f800000;
          uStack_140 = 0x3f8000003f800000;
          local_158 = local_608._0_8_;
          uStack_150 = local_608._8_8_;
          auVar76._8_8_ = 0x3f8000003f800000;
          auVar76._0_8_ = 0x3f8000003f800000;
          local_1a8 = vpand_avx(local_608,auVar76);
          local_198 = local_5f8;
          uStack_190 = uStack_5f0;
          auVar74._8_8_ = uStack_5f0;
          auVar74._0_8_ = local_5f8;
          _local_5f8 = vsubps_avx(auVar74,local_1a8);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_1d8 = local_5b8;
          uVar140 = local_1d8;
          uStack_1d0 = uStack_5b0;
          uVar141 = uStack_1d0;
          local_1e8 = local_618._0_8_;
          uVar138 = local_1e8;
          uStack_1e0 = local_618._8_8_;
          uVar139 = uStack_1e0;
          local_1d8._0_4_ = auVar7._0_4_;
          local_1d8._4_4_ = auVar7._4_4_;
          uStack_1d0._0_4_ = auVar7._8_4_;
          uStack_1d0._4_4_ = auVar7._12_4_;
          local_1e8._0_4_ = local_618._0_4_;
          local_1e8._4_4_ = local_618._4_4_;
          uStack_1e0._0_4_ = local_618._8_4_;
          uStack_1e0._4_4_ = local_618._12_4_;
          local_5b8._0_4_ = (float)local_1d8 + (float)local_1e8;
          local_5b8._4_4_ = local_1d8._4_4_ + local_1e8._4_4_;
          uStack_1d0._0_4_ = (float)uStack_1d0 + (float)uStack_1e0;
          uStack_1d0._4_4_ = uStack_1d0._4_4_ + uStack_1e0._4_4_;
          uStack_5b0._0_4_ = (float)uStack_1d0;
          uStack_5b0._4_4_ = uStack_1d0._4_4_;
          local_458 = local_5b8;
          uStack_450 = uStack_5b0;
          local_468 = local_5b8;
          uStack_460 = uStack_5b0;
          local_628 = (float)local_5b8._0_4_ * (float)local_5b8._0_4_;
          fStack_624 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
          fStack_620 = (float)uStack_1d0 * (float)uStack_1d0;
          fStack_61c = uStack_1d0._4_4_ * uStack_1d0._4_4_;
          uStack_630 = 0x3d9021bb3d9021bb;
          local_638 = (undefined1  [8])0x3d9021bb3d9021bb;
          local_580 = local_638;
          local_598 = local_5b8;
          local_4c0 = ::_ps_cephes_log_p1;
          local_428 = 0x3d9021bb3d9021bb;
          uStack_420 = 0x3d9021bb3d9021bb;
          local_438 = local_5b8;
          uStack_430 = uStack_5b0;
          local_448[0] = -0.1151461;
          local_448[1] = -0.1151461;
          afStack_440[0] = -0.1151461;
          afStack_440[1] = -0.1151461;
          auVar61._8_4_ = -0.1151461;
          auVar61._12_4_ = -0.1151461;
          auVar61._0_4_ = -0.1151461;
          auVar61._4_4_ = -0.1151461;
          auVar7 = vfmadd213ps_fma(_local_5b8,_local_638,auVar61);
          local_4d8 = ::_ps_cephes_log_p2;
          local_638 = auVar7._0_8_;
          local_3f8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_3f0 = uStack_630;
          local_408 = local_5b8;
          uStack_400 = uStack_5b0;
          local_418[0] = 0.116769984;
          local_418[1] = 0.116769984;
          afStack_410[0] = 0.116769984;
          afStack_410[1] = 0.116769984;
          auVar62._8_4_ = 0.116769984;
          auVar62._12_4_ = 0.116769984;
          auVar62._0_4_ = 0.116769984;
          auVar62._4_4_ = 0.116769984;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar62);
          local_4f0 = ::_ps_cephes_log_p3;
          local_638 = auVar7._0_8_;
          local_3c8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_3c0 = uStack_630;
          local_3d8 = local_5b8;
          uStack_3d0 = uStack_5b0;
          local_3e8[0] = -0.12420141;
          local_3e8[1] = -0.12420141;
          afStack_3e0[0] = -0.12420141;
          afStack_3e0[1] = -0.12420141;
          auVar63._8_4_ = -0.12420141;
          auVar63._12_4_ = -0.12420141;
          auVar63._0_4_ = -0.12420141;
          auVar63._4_4_ = -0.12420141;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar63);
          local_508 = ::_ps_cephes_log_p4;
          local_638 = auVar7._0_8_;
          local_398 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_390 = uStack_630;
          local_3a8 = local_5b8;
          uStack_3a0 = uStack_5b0;
          local_3b8[0] = 0.14249323;
          local_3b8[1] = 0.14249323;
          afStack_3b0[0] = 0.14249323;
          afStack_3b0[1] = 0.14249323;
          auVar64._8_4_ = 0.14249323;
          auVar64._12_4_ = 0.14249323;
          auVar64._0_4_ = 0.14249323;
          auVar64._4_4_ = 0.14249323;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar64);
          local_520 = ::_ps_cephes_log_p5;
          local_638 = auVar7._0_8_;
          local_368 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_360 = uStack_630;
          local_378 = local_5b8;
          uStack_370 = uStack_5b0;
          local_388[0] = -0.16668057;
          local_388[1] = -0.16668057;
          afStack_380[0] = -0.16668057;
          afStack_380[1] = -0.16668057;
          auVar65._8_4_ = -0.16668057;
          auVar65._12_4_ = -0.16668057;
          auVar65._0_4_ = -0.16668057;
          auVar65._4_4_ = -0.16668057;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar65);
          local_538 = ::_ps_cephes_log_p6;
          local_638 = auVar7._0_8_;
          local_338 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_330 = uStack_630;
          local_348 = local_5b8;
          uStack_340 = uStack_5b0;
          local_358[0] = 0.20000714;
          local_358[1] = 0.20000714;
          afStack_350[0] = 0.20000714;
          afStack_350[1] = 0.20000714;
          auVar66._8_4_ = 0.20000714;
          auVar66._12_4_ = 0.20000714;
          auVar66._0_4_ = 0.20000714;
          auVar66._4_4_ = 0.20000714;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar66);
          local_550 = ::_ps_cephes_log_p7;
          local_638 = auVar7._0_8_;
          local_308 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_300 = uStack_630;
          local_318 = local_5b8;
          uStack_310 = uStack_5b0;
          local_328[0] = -0.24999994;
          local_328[1] = -0.24999994;
          afStack_320[0] = -0.24999994;
          afStack_320[1] = -0.24999994;
          auVar67._8_4_ = -0.24999994;
          auVar67._12_4_ = -0.24999994;
          auVar67._0_4_ = -0.24999994;
          auVar67._4_4_ = -0.24999994;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar67);
          local_568 = ::_ps_cephes_log_p8;
          local_638 = auVar7._0_8_;
          local_2d8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_2d0 = uStack_630;
          local_2e8 = local_5b8;
          uStack_2e0 = uStack_5b0;
          local_2f8[0] = 0.3333333;
          local_2f8[1] = 0.3333333;
          afStack_2f0[0] = 0.3333333;
          afStack_2f0[1] = 0.3333333;
          auVar68._8_4_ = 0.3333333;
          auVar68._12_4_ = 0.3333333;
          auVar68._0_4_ = 0.3333333;
          auVar68._4_4_ = 0.3333333;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar68);
          local_638 = auVar7._0_8_;
          uStack_630 = auVar7._8_8_;
          local_478 = local_638;
          uVar134 = local_478;
          uStack_470 = uStack_630;
          uVar135 = uStack_470;
          local_488 = local_5b8;
          uStack_480 = uStack_5b0;
          local_478._0_4_ = auVar7._0_4_;
          local_478._4_4_ = auVar7._4_4_;
          uStack_470._0_4_ = auVar7._8_4_;
          uStack_470._4_4_ = auVar7._12_4_;
          local_638._4_4_ = local_478._4_4_ * (float)local_5b8._4_4_;
          local_638._0_4_ = (float)local_478 * (float)local_5b8._0_4_;
          uStack_630._0_4_ = (float)uStack_470 * (float)uStack_1d0;
          uStack_630._4_4_ = uStack_470._4_4_ * uStack_1d0._4_4_;
          local_4a8 = CONCAT44(fStack_624,local_628);
          uStack_4a0 = CONCAT44(fStack_61c,fStack_620);
          local_498 = local_638;
          uStack_490 = uStack_630;
          local_638._4_4_ = local_478._4_4_ * (float)local_5b8._4_4_ * fStack_624;
          local_638._0_4_ = (float)local_478 * (float)local_5b8._0_4_ * local_628;
          uStack_630._0_4_ = (float)uStack_470 * (float)uStack_1d0 * fStack_620;
          uStack_630._4_4_ = uStack_470._4_4_ * uStack_1d0._4_4_ * fStack_61c;
          local_588 = local_5f8;
          local_578 = ::_ps_cephes_log_q1;
          local_2a8 = local_5f8;
          uStack_2a0 = uStack_5f0;
          local_2b8[0] = -0.00021219444;
          local_2b8[1] = -0.00021219444;
          afStack_2b0[0] = -0.00021219444;
          afStack_2b0[1] = -0.00021219444;
          local_2c8 = local_638;
          uStack_2c0 = uStack_630;
          auVar69._8_4_ = -0.00021219444;
          auVar69._12_4_ = -0.00021219444;
          auVar69._0_4_ = -0.00021219444;
          auVar69._4_4_ = -0.00021219444;
          auVar7 = vfmadd213ps_fma(auVar69,_local_5f8,_local_638);
          local_e0 = &local_628;
          local_e8 = ::_ps_0p5;
          local_b8 = CONCAT44(fStack_624,local_628);
          uStack_b0 = CONCAT44(fStack_61c,fStack_620);
          auVar95._4_4_ = fStack_624;
          auVar95._0_4_ = local_628;
          auVar95._8_4_ = fStack_620;
          auVar95._12_4_ = fStack_61c;
          local_c8[0] = 0.5;
          local_c8[1] = 0.5;
          afStack_c0[0] = 0.5;
          afStack_c0[1] = 0.5;
          local_638 = auVar7._0_8_;
          local_d8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_d0 = uStack_630;
          auVar78._8_4_ = 0.5;
          auVar78._12_4_ = 0.5;
          auVar78._0_4_ = 0.5;
          auVar78._4_4_ = 0.5;
          _local_638 = vfnmadd213ps_fma(auVar78,auVar95,auVar7);
          local_1f8 = local_5b8;
          uStack_1f0 = uStack_5b0;
          local_208 = local_638;
          uVar136 = local_208;
          uStack_200 = uStack_630;
          uVar137 = uStack_200;
          local_208._0_4_ = local_638._0_4_;
          local_208._4_4_ = local_638._4_4_;
          uStack_200._0_4_ = local_638._8_4_;
          uStack_200._4_4_ = local_638._12_4_;
          local_5b8._4_4_ = (float)local_5b8._4_4_ + local_208._4_4_;
          local_5b8._0_4_ = (float)local_5b8._0_4_ + (float)local_208;
          uStack_5b0._0_4_ = (float)uStack_1d0 + (float)uStack_200;
          uStack_5b0._4_4_ = uStack_1d0._4_4_ + uStack_200._4_4_;
          local_590 = ::_ps_cephes_log_q2;
          local_278 = local_5f8;
          uStack_270 = uStack_5f0;
          local_288[0] = 0.6933594;
          local_288[1] = 0.6933594;
          afStack_280[0] = 0.6933594;
          afStack_280[1] = 0.6933594;
          local_298 = local_5b8;
          uStack_290 = uStack_5b0;
          auVar70._8_4_ = 0.6933594;
          auVar70._12_4_ = 0.6933594;
          auVar70._0_4_ = 0.6933594;
          auVar70._4_4_ = 0.6933594;
          auVar7 = vfmadd213ps_fma(auVar70,_local_5f8,_local_5b8);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_68 = local_5b8;
          uStack_60 = uStack_5b0;
          local_78 = local_5e8._0_8_;
          uStack_70 = local_5e8._8_8_;
          _local_5b8 = vpor_avx(auVar7,local_5e8);
          local_c28 = local_5b8;
          uStack_c20 = uStack_5b0;
          local_bdc = 0x3f800000;
          local_bf8 = 0x3f800000;
          uStack_bf4 = 0x3f800000;
          uStack_bf0 = 0x3f800000;
          uStack_bec = 0x3f800000;
          local_c38 = 0x3f8000003f800000;
          uStack_c30 = 0x3f8000003f800000;
          local_bfc = 0x40000000;
          local_c18 = 0x40000000;
          uStack_c14 = 0x40000000;
          uStack_c10 = 0x40000000;
          uStack_c0c = 0x40000000;
          local_c48 = 0x4000000040000000;
          uStack_c40 = 0x4000000040000000;
          local_ba8 = local_5b8;
          uVar122 = local_ba8;
          uStack_ba0 = uStack_5b0;
          uVar123 = uStack_ba0;
          local_ba8._0_4_ = local_5b8._0_4_;
          local_ba8._4_4_ = local_5b8._4_4_;
          uStack_ba0._0_4_ = local_5b8._8_4_;
          uStack_ba0._4_4_ = local_5b8._12_4_;
          local_b88 = (float)local_ba8 * 2.0;
          fStack_b84 = local_ba8._4_4_ * 2.0;
          fStack_b80 = (float)uStack_ba0 * 2.0;
          fStack_b7c = uStack_ba0._4_4_ * 2.0;
          local_b4c = 0x3f800000;
          local_b68 = 0x3f800000;
          uStack_b64 = 0x3f800000;
          uStack_b60 = 0x3f800000;
          uStack_b5c = 0x3f800000;
          local_b98 = 0x3f8000003f800000;
          uStack_b90 = 0x3f8000003f800000;
          local_b78 = 0;
          uStack_b70 = 0;
          local_788 = CONCAT44(fStack_b84,local_b88);
          uStack_780 = CONCAT44(fStack_b7c,fStack_b80);
          local_778 = 0;
          uStack_770 = 0;
          auVar54._8_8_ = uStack_780;
          auVar54._0_8_ = local_788;
          auVar7 = vsubps_avx(ZEXT816(0),auVar54);
          local_a88 = 0;
          uStack_a80 = 0;
          local_ad8 = 0x3f8000003f800000;
          uStack_ad0 = 0x3f8000003f800000;
          local_a98._0_8_ = auVar7._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          local_7f8 = local_a98._0_8_;
          uStack_7f0 = local_a98._8_8_;
          local_808 = 0x42b0c0a542b0c0a5;
          uStack_800 = 0x42b0c0a542b0c0a5;
          auVar53._8_8_ = 0x42b0c0a542b0c0a5;
          auVar53._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar53);
          local_a98._0_8_ = auVar7._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          local_818 = local_a98._0_8_;
          uStack_810 = local_a98._8_8_;
          local_828 = 0xc2b0c0a5c2b0c0a5;
          uStack_820 = 0xc2b0c0a5c2b0c0a5;
          auVar52._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar52,auVar7);
          local_a98._0_8_ = auVar6._0_8_;
          local_a98._8_8_ = auVar6._8_8_;
          local_998 = local_a98._0_8_;
          uVar128 = local_998;
          uStack_990 = local_a98._8_8_;
          uVar129 = uStack_990;
          local_9a8 = 0x3fb8aa3b3fb8aa3b;
          uStack_9a0 = 0x3fb8aa3b3fb8aa3b;
          local_998._0_4_ = auVar6._0_4_;
          local_998._4_4_ = auVar6._4_4_;
          uStack_990._0_4_ = auVar6._8_4_;
          uStack_990._4_4_ = auVar6._12_4_;
          local_ab8._4_4_ = local_998._4_4_ * 1.442695;
          local_ab8._0_4_ = (float)local_998 * 1.442695;
          uStack_ab0._0_4_ = (float)uStack_990 * 1.442695;
          uStack_ab0._4_4_ = uStack_990._4_4_ * 1.442695;
          local_7b8 = local_ab8;
          uStack_7b0 = uStack_ab0;
          local_7c8 = 0x3f0000003f000000;
          uStack_7c0 = 0x3f0000003f000000;
          local_ab8._0_4_ = (float)local_998 * 1.442695 + 0.5;
          local_ab8._4_4_ = local_998._4_4_ * 1.442695 + 0.5;
          fVar146 = (float)uStack_990 * 1.442695 + 0.5;
          fVar147 = uStack_990._4_4_ * 1.442695 + 0.5;
          uStack_ab0._0_4_ = fVar146;
          uStack_ab0._4_4_ = fVar147;
          local_738 = local_ab8;
          uStack_730 = uStack_ab0;
          local_ac8._4_4_ = (int)(float)local_ab8._4_4_;
          local_ac8._0_4_ = (int)(float)local_ab8._0_4_;
          local_ac8._8_4_ = (int)fVar146;
          local_ac8._12_4_ = (int)fVar147;
          local_728 = local_ac8._0_8_;
          uStack_720 = local_ac8._8_8_;
          auVar56._8_8_ = local_ac8._8_8_;
          auVar56._0_8_ = local_ac8._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar56);
          local_aa8 = auVar5._0_8_;
          uStack_aa0 = auVar5._8_8_;
          local_708 = local_aa8;
          uStack_700 = uStack_aa0;
          local_718 = local_ab8;
          uStack_710 = uStack_ab0;
          auVar57._8_8_ = uStack_ab0;
          auVar57._0_8_ = local_ab8;
          auVar7 = vcmpps_avx(auVar57,auVar5,1);
          local_ae8._0_8_ = auVar7._0_8_;
          local_ae8._8_8_ = auVar7._8_8_;
          local_6e8 = local_ae8._0_8_;
          uStack_6e0 = local_ae8._8_8_;
          local_6f8 = 0x3f8000003f800000;
          uStack_6f0 = 0x3f8000003f800000;
          auVar58._8_8_ = 0x3f8000003f800000;
          auVar58._0_8_ = 0x3f8000003f800000;
          local_ae8 = vpand_avx(auVar7,auVar58);
          local_798 = local_aa8;
          uStack_790 = uStack_aa0;
          local_7a8 = local_ae8._0_8_;
          uStack_7a0 = local_ae8._8_8_;
          _local_ab8 = vsubps_avx(auVar5,local_ae8);
          local_6c8 = local_ab8;
          local_6b8 = ::_ps_cephes_exp_C1;
          local_a78 = local_a98;
          local_678 = local_ab8;
          uStack_670 = uStack_ab0;
          local_688[0] = 0.6933594;
          local_688[1] = 0.6933594;
          afStack_680[0] = 0.6933594;
          afStack_680[1] = 0.6933594;
          local_698 = local_a98._0_8_;
          uStack_690 = local_a98._8_8_;
          auVar59._8_4_ = 0.6933594;
          auVar59._12_4_ = 0.6933594;
          auVar59._0_4_ = 0.6933594;
          auVar59._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar59,_local_ab8,auVar6);
          local_6d0 = ::_ps_cephes_exp_C2;
          local_648 = local_ab8;
          uStack_640 = uStack_ab0;
          local_658[0] = -0.00021219444;
          local_658[1] = -0.00021219444;
          afStack_650[0] = -0.00021219444;
          afStack_650[1] = -0.00021219444;
          local_a98._0_8_ = auVar7._0_8_;
          local_668 = local_a98._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          uStack_660 = local_a98._8_8_;
          auVar60._8_4_ = -0.00021219444;
          auVar60._12_4_ = -0.00021219444;
          auVar60._0_4_ = -0.00021219444;
          auVar60._4_4_ = -0.00021219444;
          local_a98 = vfnmadd213ps_fma(auVar60,_local_ab8,auVar7);
          local_9b8 = local_a98._0_8_;
          uVar126 = local_9b8;
          uStack_9b0 = local_a98._8_8_;
          uVar127 = uStack_9b0;
          local_9c8 = local_a98._0_8_;
          uStack_9c0 = local_a98._8_8_;
          local_9b8._0_4_ = local_a98._0_4_;
          local_9b8._4_4_ = local_a98._4_4_;
          uStack_9b0._0_4_ = local_a98._8_4_;
          uStack_9b0._4_4_ = local_a98._12_4_;
          local_aa8._4_4_ = local_9b8._4_4_ * local_9b8._4_4_;
          local_aa8._0_4_ = (float)local_9b8 * (float)local_9b8;
          uStack_aa0._0_4_ = (float)uStack_9b0 * (float)uStack_9b0;
          uStack_aa0._4_4_ = uStack_9b0._4_4_ * uStack_9b0._4_4_;
          uStack_af0 = 0x3950696739506967;
          local_af8 = (undefined1  [8])0x3950696739506967;
          local_a68 = local_af8;
          local_a00 = ::_ps_cephes_exp_p1;
          local_968 = 0x3950696739506967;
          uStack_960 = 0x3950696739506967;
          local_978 = local_a98._0_8_;
          uStack_970 = local_a98._8_8_;
          local_988[0] = 0.0013981999;
          local_988[1] = 0.0013981999;
          afStack_980[0] = 0.0013981999;
          afStack_980[1] = 0.0013981999;
          auVar45._8_4_ = 0.0013981999;
          auVar45._12_4_ = 0.0013981999;
          auVar45._0_4_ = 0.0013981999;
          auVar45._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_a98,_local_af8,auVar45);
          local_a18 = ::_ps_cephes_exp_p2;
          local_af8 = auVar7._0_8_;
          local_938 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_930 = uStack_af0;
          local_948 = local_a98._0_8_;
          uStack_940 = local_a98._8_8_;
          local_958[0] = 0.008333452;
          local_958[1] = 0.008333452;
          afStack_950[0] = 0.008333452;
          afStack_950[1] = 0.008333452;
          auVar46._8_4_ = 0.008333452;
          auVar46._12_4_ = 0.008333452;
          auVar46._0_4_ = 0.008333452;
          auVar46._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar46);
          local_a30 = ::_ps_cephes_exp_p3;
          local_af8 = auVar7._0_8_;
          local_908 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_900 = uStack_af0;
          local_918 = local_a98._0_8_;
          uStack_910 = local_a98._8_8_;
          local_928[0] = 0.041665796;
          local_928[1] = 0.041665796;
          afStack_920[0] = 0.041665796;
          afStack_920[1] = 0.041665796;
          auVar47._8_4_ = 0.041665796;
          auVar47._12_4_ = 0.041665796;
          auVar47._0_4_ = 0.041665796;
          auVar47._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar47);
          local_a48 = ::_ps_cephes_exp_p4;
          local_af8 = auVar7._0_8_;
          local_8d8 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_8d0 = uStack_af0;
          local_8e8 = local_a98._0_8_;
          uStack_8e0 = local_a98._8_8_;
          local_8f8[0] = 0.16666666;
          local_8f8[1] = 0.16666666;
          afStack_8f0[0] = 0.16666666;
          afStack_8f0[1] = 0.16666666;
          auVar48._8_4_ = 0.16666666;
          auVar48._12_4_ = 0.16666666;
          auVar48._0_4_ = 0.16666666;
          auVar48._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar48);
          local_a60 = ::_ps_cephes_exp_p5;
          local_af8 = auVar7._0_8_;
          local_8a8 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_8a0 = uStack_af0;
          local_8b8 = local_a98._0_8_;
          uStack_8b0 = local_a98._8_8_;
          local_8c8[0] = 0.5;
          local_8c8[1] = 0.5;
          afStack_8c0[0] = 0.5;
          afStack_8c0[1] = 0.5;
          auVar49._8_4_ = 0.5;
          auVar49._12_4_ = 0.5;
          auVar49._0_4_ = 0.5;
          auVar49._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar49);
          local_a70 = local_aa8;
          local_af8 = auVar7._0_8_;
          local_878 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_870 = uStack_af0;
          local_888 = local_aa8;
          uStack_880 = uStack_aa0;
          local_898 = local_a98._0_8_;
          uStack_890 = local_a98._8_8_;
          auVar7 = vfmadd213ps_fma(_local_aa8,auVar7,local_a98);
          local_af8 = auVar7._0_8_;
          uStack_af0 = auVar7._8_8_;
          local_7d8 = local_af8;
          uVar130 = local_7d8;
          uStack_7d0 = uStack_af0;
          uVar131 = uStack_7d0;
          local_7e8 = 0x3f8000003f800000;
          uStack_7e0 = 0x3f8000003f800000;
          local_7d8._0_4_ = auVar7._0_4_;
          local_7d8._4_4_ = auVar7._4_4_;
          uStack_7d0._0_4_ = auVar7._8_4_;
          uStack_7d0._4_4_ = auVar7._12_4_;
          local_af8._4_4_ = local_7d8._4_4_ + 1.0;
          local_af8._0_4_ = (float)local_7d8 + 1.0;
          uStack_af0._0_4_ = (float)uStack_7d0 + 1.0;
          uStack_af0._4_4_ = uStack_7d0._4_4_ + 1.0;
          local_748 = local_ab8;
          uVar132 = local_748;
          uStack_740 = uStack_ab0;
          uVar133 = uStack_740;
          local_748._0_4_ = local_ab8._0_4_;
          local_748._4_4_ = local_ab8._4_4_;
          uStack_740._0_4_ = local_ab8._8_4_;
          uStack_740._4_4_ = local_ab8._12_4_;
          local_ac8._4_4_ = (int)local_748._4_4_;
          local_ac8._0_4_ = (int)(float)local_748;
          local_ac8._8_4_ = (int)(float)uStack_740;
          local_ac8._12_4_ = (int)uStack_740._4_4_;
          local_858 = local_ac8._0_8_;
          uStack_850 = local_ac8._8_8_;
          local_868 = 0x7f0000007f;
          uStack_860 = 0x7f0000007f;
          auVar51._8_8_ = local_ac8._8_8_;
          auVar51._0_8_ = local_ac8._0_8_;
          auVar50._8_8_ = 0x7f0000007f;
          auVar50._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar51,auVar50);
          local_ac8._0_8_ = auVar7._0_8_;
          local_ac8._8_8_ = auVar7._8_8_;
          local_838 = local_ac8._0_8_;
          uStack_830 = local_ac8._8_8_;
          local_83c = 0x17;
          local_ac8 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_6a8 = local_ac8._0_8_;
          uStack_6a0 = local_ac8._8_8_;
          local_b08 = local_ac8._0_8_;
          uStack_b00 = local_ac8._8_8_;
          local_9d8 = _local_af8;
          local_9e8 = local_ac8._0_8_;
          uVar124 = local_9e8;
          uStack_9e0 = local_ac8._8_8_;
          uVar125 = uStack_9e0;
          local_9e8._0_4_ = local_ac8._0_4_;
          local_9e8._4_4_ = local_ac8._4_4_;
          uStack_9e0._0_4_ = local_ac8._8_4_;
          uStack_9e0._4_4_ = local_ac8._12_4_;
          local_af8._0_4_ = ((float)local_7d8 + 1.0) * (float)local_9e8;
          local_af8._4_4_ = (local_7d8._4_4_ + 1.0) * local_9e8._4_4_;
          uStack_9e0._0_4_ = ((float)uStack_7d0 + 1.0) * (float)uStack_9e0;
          uStack_9e0._4_4_ = (uStack_7d0._4_4_ + 1.0) * uStack_9e0._4_4_;
          uStack_af0._0_4_ = (float)uStack_9e0;
          uStack_af0._4_4_ = uStack_9e0._4_4_;
          local_b48 = local_af8;
          uStack_b40 = uStack_af0;
          local_b28 = (float)local_af8._0_4_ + 1.0;
          fStack_b24 = (float)local_af8._4_4_ + 1.0;
          fStack_b20 = (float)uStack_9e0 + 1.0;
          fStack_b1c = uStack_9e0._4_4_ + 1.0;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar43._4_4_ = fStack_b24;
          auVar43._0_4_ = local_b28;
          auVar43._8_4_ = fStack_b20;
          auVar43._12_4_ = fStack_b1c;
          _local_bc8 = vdivps_avx(auVar44,auVar43);
          local_758._0_4_ = (float)local_bc8._0_4_ * 2.0;
          local_758._4_4_ = (float)local_bc8._4_4_ * 2.0;
          local_758._8_4_ = fStack_bc0 * 2.0;
          local_758._12_4_ = fStack_bbc * 2.0;
          auVar55._8_8_ = 0x3f8000003f800000;
          auVar55._0_8_ = 0x3f8000003f800000;
          _local_1738 = vsubps_avx(local_758,auVar55);
          local_1a08._4_4_ = local_16a8._4_4_ * (float)local_1738._4_4_;
          local_1a08._0_4_ = (float)local_16a8 * (float)local_1738._0_4_;
          uStack_1a00._0_4_ = (float)local_1728._8_4_ * fStack_1730;
          uStack_1a00._4_4_ = fStack_171c * fStack_172c;
          _local_1728 = local_2ac8;
          local_14d8 = local_14f8;
          local_14d0 = local_14e8;
          local_14c0 = local_14f8;
          local_14b8 = local_14e8;
          local_14a8 = local_14f8;
          local_14a0 = local_14e8;
          local_1490 = local_14f8;
          local_1488 = local_14e8;
          local_1478 = local_14f8;
          local_1470 = local_14e8;
          local_1468 = uVar8;
          uStack_1460 = uVar9;
          local_1438 = uVar114;
          uStack_1430 = uVar115;
          local_1418 = uVar116;
          uStack_1410 = uVar117;
          local_1258 = uVar118;
          uStack_1250 = uVar119;
          local_e48 = uVar120;
          uStack_e40 = uVar121;
          local_d58 = local_14f8;
          local_d40 = local_14f8;
          local_d30 = local_d48;
          local_bd8 = local_c48;
          uStack_bd0 = uStack_c40;
          local_bb8 = local_c48;
          uStack_bb0 = uStack_c40;
          local_ba8 = uVar122;
          uStack_ba0 = uVar123;
          local_b38 = local_b98;
          uStack_b30 = uStack_b90;
          local_b18 = local_b98;
          uStack_b10 = uStack_b90;
          local_a58 = local_a78;
          local_a50 = local_a68;
          local_a40 = local_a78;
          local_a38 = local_a68;
          local_a28 = local_a78;
          local_a20 = local_a68;
          local_a10 = local_a78;
          local_a08 = local_a68;
          local_9f8 = local_a78;
          local_9f0 = local_a68;
          local_9e8 = uVar124;
          uStack_9e0 = uVar125;
          local_9b8 = uVar126;
          uStack_9b0 = uVar127;
          local_998 = uVar128;
          uStack_990 = uVar129;
          local_7d8 = uVar130;
          uStack_7d0 = uVar131;
          local_768 = local_c38;
          uStack_760 = uStack_c30;
          local_748 = uVar132;
          uStack_740 = uVar133;
          local_6d8 = local_a78;
          local_6c0 = local_a78;
          local_6b0 = local_6c8;
          local_570 = local_588;
          local_560 = local_598;
          local_558 = local_580;
          local_548 = local_598;
          local_540 = local_580;
          local_530 = local_598;
          local_528 = local_580;
          local_518 = local_598;
          local_510 = local_580;
          local_500 = local_598;
          local_4f8 = local_580;
          local_4e8 = local_598;
          local_4e0 = local_580;
          local_4d0 = local_598;
          local_4c8 = local_580;
          local_4b8 = local_598;
          local_4b0 = local_580;
          local_478 = uVar134;
          uStack_470 = uVar135;
          local_208 = uVar136;
          uStack_200 = uVar137;
          local_1e8 = uVar138;
          uStack_1e0 = uVar139;
          local_1d8 = uVar140;
          uStack_1d0 = uVar141;
          local_1b8 = uVar142;
          uStack_1b0 = uVar143;
          local_f0 = local_580;
          break;
        case 6:
          local_1950 = in_stack_00000040;
          local_1958 = 0;
          local_19c8 = *(float *)*in_stack_00000040;
          local_1a58 = CONCAT44(local_19c8,local_19c8);
          uStack_1a50 = CONCAT44(local_19c8,local_19c8);
          local_1960 = in_stack_00000040;
          local_1968 = 1;
          local_19e8 = *(float *)(*in_stack_00000040 + 4);
          local_1a68 = CONCAT44(local_19e8,local_19e8);
          uStack_1a60 = CONCAT44(local_19e8,local_19e8);
          local_16e8 = local_2ac8;
          local_16ac = 0x3f800000;
          local_16c8 = 0x3f800000;
          uStack_16c4 = 0x3f800000;
          uStack_16c0 = 0x3f800000;
          uStack_16bc = 0x3f800000;
          local_1718 = 0x3f8000003f800000;
          uStack_1710 = 0x3f8000003f800000;
          local_1678 = local_2ac8._0_8_;
          uStack_1670 = local_2ac8._8_8_;
          local_1618 = (float)local_16a8 * local_19c8;
          fStack_1614 = local_16a8._4_4_ * local_19c8;
          fStack_1610 = (float)local_1728._8_4_ * local_19c8;
          fStack_160c = fStack_171c * local_19c8;
          local_1708._4_4_ = fStack_1614 + local_19e8;
          local_1708._0_4_ = local_1618 + local_19e8;
          uStack_1700._0_4_ = fStack_1610 + local_19e8;
          uStack_1700._4_4_ = fStack_160c + local_19e8;
          local_16d8 = ZEXT416(0) << 0x20;
          local_1658 = local_1708;
          uStack_1650 = uStack_1700;
          local_1668 = 0;
          uStack_1660 = 0;
          auVar12._8_8_ = uStack_1700;
          auVar12._0_8_ = local_1708;
          auVar7 = vmaxps_avx(auVar12,ZEXT816(0));
          local_1708 = auVar7._0_8_;
          uStack_1700 = auVar7._8_8_;
          local_1638 = local_1708;
          uStack_1630 = uStack_1700;
          auVar13._8_8_ = 0x3f8000003f800000;
          auVar13._0_8_ = 0x3f8000003f800000;
          _local_1708 = vminps_avx(auVar7,auVar13);
          local_16a8 = local_2ac8._0_8_;
          uStack_16a0 = local_2ac8._8_8_;
          local_1698._0_4_ = local_1708._0_4_;
          local_1698._4_4_ = local_1708._4_4_;
          fStack_1690 = local_1708._8_4_;
          fStack_168c = local_1708._12_4_;
          local_1a08._4_4_ = (float)local_1698._4_4_ * fVar147;
          local_1a08._0_4_ = (float)local_1698._0_4_ * fVar146;
          uStack_1a00._0_4_ = fStack_1690 * (float)local_1728._8_4_;
          uStack_1a00._4_4_ = fStack_168c * fStack_171c;
          fStack_19e4 = local_19e8;
          fStack_19e0 = local_19e8;
          fStack_19dc = local_19e8;
          local_19cc = local_19e8;
          fStack_19c4 = local_19c8;
          fStack_19c0 = local_19c8;
          fStack_19bc = local_19c8;
          local_19ac = local_19c8;
          local_16f8 = local_1a58;
          uStack_16f0 = uStack_1a50;
          _local_1698 = _local_1708;
          local_1688 = local_1a58;
          uStack_1680 = uStack_1a50;
          local_1648 = local_1718;
          uStack_1640 = uStack_1710;
          local_1628 = local_1a68;
          uStack_1620 = uStack_1a60;
          break;
        default:
          _local_1a08 = local_2ac8;
        }
        local_1900 = (undefined8 *)
                     (local_2a70 + (long)((local_29f4 * local_29ac + local_29f8) * 4) * 4);
        local_1918 = local_1a08;
        uStack_1910 = uStack_1a00;
        *local_1900 = local_1a08;
        local_1900[1] = uStack_1a00;
      }
    }
  }
  return;
}

Assistant:

static void deformableconv2d_pack4_sse(const std::vector<Mat>& bottom_blobs, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int pad_left, int pad_top, int activation_type, const Mat& activation_params, const Option& opt)
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];
    const bool has_mask = (bottom_blobs.size() == 3);
    const bool offset_not_pack = offset.elempack == 1;
    const bool mask_not_pack = has_mask ? bottom_blobs[2].elempack == 1 : true;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias_data_ptr = bias_data;
    const int elempack = 4;
    const int out_elempack = 4;
    const int wstep = out_elempack * elempack;
    const float zeros[out_elempack] = {0.f, 0.f, 0.f, 0.f};
    const float* zeros_ptr = zeros;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < outh; h_col++)
    {
        for (int w_col = 0; w_col < outw; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < outch; oc++)
            {
                const float* kptr = weight_data_packed.channel(oc);
                float* outptr = top_blob.channel(oc);
                __m128 _sum = _mm_setzero_ps();
                if (bias_data_ptr)
                    _sum = _mm_loadu_ps(bias_data_ptr + oc * out_elempack);
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        float offset_h = 0.f;
                        float offset_w = 0.f;
                        float mask_ = 1.f;
                        if (offset_not_pack)
                        {
                            offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                            offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        }
                        else
                        {
                            const int y_c = (i * kernel_w + j) * 2;
                            const int x_c = (i * kernel_w + j) * 2 + 1;
                            offset_h = offset.channel(y_c / offset.elempack).row(h_col)[w_col * offset.elempack + y_c % offset.elempack];
                            offset_w = offset.channel(x_c / offset.elempack).row(h_col)[w_col * offset.elempack + x_c % offset.elempack];
                        }
                        if (has_mask)
                        {
                            const Mat& mask = bottom_blobs[2];
                            if (mask_not_pack)
                            {
                                mask_ = mask.channel(i * kernel_w + j).row(h_col)[w_col];
                            }
                            else
                            {
                                const int m_c = i * kernel_w + j;
                                mask_ = mask.channel(m_c / mask.elempack).row(h_col)[w_col * mask.elempack + m_c % mask.elempack];
                            }
                        }
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        int v1_pos = 0;
                        int v2_pos = 0;
                        int v3_pos = 0;
                        int v4_pos = 0;
                        if (cond)
                        {
                            int h_low = (int)floorf(h_im);
                            int w_low = (int)floorf(w_im);
                            int h_high = h_low + 1;
                            int w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                            if (v1_cond)
                                v1_pos = h_low * w + w_low;
                            if (v2_cond)
                                v2_pos = h_low * w + w_high;
                            if (v3_cond)
                                v3_pos = h_high * w + w_low;
                            if (v4_cond)
                                v4_pos = h_high * w + w_high;

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }
                        const float w1s[out_elempack] = {w1, w1, w1, w1};
                        const float* w1_ptr = w1s;
                        const float w2s[out_elempack] = {w2, w2, w2, w2};
                        const float* w2_ptr = w2s;
                        const float w3s[out_elempack] = {w3, w3, w3, w3};
                        const float* w3_ptr = w3s;
                        const float w4s[out_elempack] = {w4, w4, w4, w4};
                        const float* w4_ptr = w4s;
                        const float masks[out_elempack] = {mask_, mask_, mask_, mask_};
                        const float* mask_ptr = masks;

                        for (int ic = 0; ic < inch; ic++)
                        {
                            const float* data_im_ptr = bottom_blob.channel(ic);
                            __m128 _val_channel0 = _mm_loadu_ps(zeros_ptr);
                            __m128 _val_channel1 = _val_channel0;
                            __m128 _val_channel2 = _val_channel0;
                            __m128 _val_channel3 = _val_channel0;
                            if (cond)
                            {
                                __m128 _v1_channel0 = _val_channel0;
                                __m128 _v1_channel1 = _val_channel0;
                                __m128 _v1_channel2 = _val_channel0;
                                __m128 _v1_channel3 = _val_channel0;
                                __m128 _v2_channel0 = _val_channel0;
                                __m128 _v2_channel1 = _val_channel0;
                                __m128 _v2_channel2 = _val_channel0;
                                __m128 _v2_channel3 = _val_channel0;
                                __m128 _v3_channel0 = _val_channel0;
                                __m128 _v3_channel1 = _val_channel0;
                                __m128 _v3_channel2 = _val_channel0;
                                __m128 _v3_channel3 = _val_channel0;
                                __m128 _v4_channel0 = _val_channel0;
                                __m128 _v4_channel1 = _val_channel0;
                                __m128 _v4_channel2 = _val_channel0;
                                __m128 _v4_channel3 = _val_channel0;
                                if (v1_cond)
                                {
                                    _v1_channel0 = _mm_load1_ps(data_im_ptr + v1_pos * elempack);
                                    _v1_channel1 = _mm_load1_ps(data_im_ptr + v1_pos * elempack + 1);
                                    _v1_channel2 = _mm_load1_ps(data_im_ptr + v1_pos * elempack + 2);
                                    _v1_channel3 = _mm_load1_ps(data_im_ptr + v1_pos * elempack + 3);
                                }
                                if (v2_cond)
                                {
                                    _v2_channel0 = _mm_load1_ps(data_im_ptr + v2_pos * elempack);
                                    _v2_channel1 = _mm_load1_ps(data_im_ptr + v2_pos * elempack + 1);
                                    _v2_channel2 = _mm_load1_ps(data_im_ptr + v2_pos * elempack + 2);
                                    _v2_channel3 = _mm_load1_ps(data_im_ptr + v2_pos * elempack + 3);
                                }
                                if (v3_cond)
                                {
                                    _v3_channel0 = _mm_load1_ps(data_im_ptr + v3_pos * elempack);
                                    _v3_channel1 = _mm_load1_ps(data_im_ptr + v3_pos * elempack + 1);
                                    _v3_channel2 = _mm_load1_ps(data_im_ptr + v3_pos * elempack + 2);
                                    _v3_channel3 = _mm_load1_ps(data_im_ptr + v3_pos * elempack + 3);
                                }
                                if (v4_cond)
                                {
                                    _v4_channel0 = _mm_load1_ps(data_im_ptr + v4_pos * elempack);
                                    _v4_channel1 = _mm_load1_ps(data_im_ptr + v4_pos * elempack + 1);
                                    _v4_channel2 = _mm_load1_ps(data_im_ptr + v4_pos * elempack + 2);
                                    _v4_channel3 = _mm_load1_ps(data_im_ptr + v4_pos * elempack + 3);
                                }
                                __m128 _w1 = _mm_loadu_ps(w1_ptr);
                                __m128 _w2 = _mm_loadu_ps(w2_ptr);
                                __m128 _w3 = _mm_loadu_ps(w3_ptr);
                                __m128 _w4 = _mm_loadu_ps(w4_ptr);
                                _val_channel0 = _mm_comp_fmadd_ps(_v1_channel0, _w1, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v2_channel0, _w2, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v3_channel0, _w3, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v4_channel0, _w4, _val_channel0);
                                _val_channel1 = _mm_comp_fmadd_ps(_v1_channel1, _w1, _val_channel1);
                                _val_channel1 = _mm_comp_fmadd_ps(_v2_channel1, _w2, _val_channel1);
                                _val_channel1 = _mm_comp_fmadd_ps(_v3_channel1, _w3, _val_channel1);
                                _val_channel1 = _mm_comp_fmadd_ps(_v4_channel1, _w4, _val_channel1);
                                _val_channel2 = _mm_comp_fmadd_ps(_v1_channel2, _w1, _val_channel2);
                                _val_channel2 = _mm_comp_fmadd_ps(_v2_channel2, _w2, _val_channel2);
                                _val_channel2 = _mm_comp_fmadd_ps(_v3_channel2, _w3, _val_channel2);
                                _val_channel2 = _mm_comp_fmadd_ps(_v4_channel2, _w4, _val_channel2);
                                _val_channel3 = _mm_comp_fmadd_ps(_v1_channel3, _w1, _val_channel3);
                                _val_channel3 = _mm_comp_fmadd_ps(_v2_channel3, _w2, _val_channel3);
                                _val_channel3 = _mm_comp_fmadd_ps(_v3_channel3, _w3, _val_channel3);
                                _val_channel3 = _mm_comp_fmadd_ps(_v4_channel3, _w4, _val_channel3);
                            }
                            if (has_mask)
                            {
                                __m128 _mask = _mm_loadu_ps(mask_ptr);
                                _val_channel0 = _mm_mul_ps(_val_channel0, _mask);
                                _val_channel1 = _mm_mul_ps(_val_channel1, _mask);
                                _val_channel2 = _mm_mul_ps(_val_channel2, _mask);
                                _val_channel3 = _mm_mul_ps(_val_channel3, _mask);
                            }
                            __m128 _conv_w0 = _mm_load_ps(kptr);
                            __m128 _conv_w1 = _mm_load_ps(kptr + out_elempack); // 1 * out_elempack
                            _sum = _mm_comp_fmadd_ps(_val_channel0, _conv_w0, _sum);
                            _sum = _mm_comp_fmadd_ps(_val_channel1, _conv_w1, _sum);
                            __m128 _conv_w2 = _mm_load_ps(kptr + 8);  // 2 * out_elempack
                            __m128 _conv_w3 = _mm_load_ps(kptr + 12); // 3 * out_elempack
                            _sum = _mm_comp_fmadd_ps(_val_channel2, _conv_w2, _sum);
                            _sum = _mm_comp_fmadd_ps(_val_channel3, _conv_w3, _sum);
                            kptr += wstep;
                        }
                    }
                }
                _sum = activation_sse(_sum, activation_type, activation_params);
                _mm_storeu_ps(outptr + (h_col * outw + w_col) * out_elempack, _sum);
            }
        }
    }
}